

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_with_reopen_test(void)

{
  fdb_encryption_key *pfVar1;
  uint64_t *puVar2;
  short *psVar3;
  fdb_status fVar4;
  int iVar5;
  fdb_kvs_handle *pfVar6;
  size_t sVar7;
  size_t sVar8;
  btree *pbVar9;
  size_t sVar10;
  fdb_kvs_handle *pfVar11;
  size_t sVar12;
  uint64_t extraout_RAX;
  uint64_t uVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_config *config;
  fdb_kvs_info *info_00;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar15;
  size_t sVar16;
  code *__s;
  void *pvVar17;
  fdb_kvs_handle **ppfVar18;
  fdb_kvs_handle *pfVar19;
  char *pcVar20;
  char cVar21;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar22;
  char *pcVar23;
  fdb_file_info *info_01;
  fdb_file_handle *pfVar24;
  fdb_iterator *pfVar25;
  btree *pbVar26;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle [8];
  uint uVar27;
  btree *unaff_R12;
  long lVar28;
  bool *pbVar29;
  fdb_kvs_handle *unaff_R13;
  fdb_config *pfVar30;
  ulong uVar31;
  size_t sVar32;
  fdb_doc **ppfVar33;
  __atomic_base<unsigned_long> _Var34;
  timeval tVar35;
  timeval tVar36;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_kvs_handle *second_dbh;
  fdb_file_handle *second_dbfile;
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  char temp [256];
  fdb_kvs_handle *pfStack_18650;
  undefined1 auStack_18648 [16];
  undefined1 auStack_18638 [8];
  undefined1 auStack_18630 [80];
  ulong uStack_185e0;
  timeval tStack_185c0;
  fdb_file_info afStack_185b0 [3];
  fdb_file_info afStack_184b0 [3];
  fdb_config fStack_183b0;
  fdb_kvs_handle *pfStack_182b8;
  fdb_kvs_handle *pfStack_182b0;
  fdb_kvs_handle *pfStack_182a8;
  fdb_config *pfStack_182a0;
  fdb_doc **ppfStack_18298;
  fdb_kvs_handle *pfStack_18290;
  fdb_file_handle *pfStack_18280;
  fdb_kvs_handle *pfStack_18278;
  timeval atStack_18270 [2];
  timeval tStack_18250;
  timeval tStack_18240;
  undefined1 auStack_18230 [70];
  undefined1 uStack_181ea;
  undefined8 uStack_181e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18120;
  fdb_kvs_handle *pfStack_18118;
  fdb_kvs_handle *pfStack_18110;
  fdb_kvs_handle *pfStack_18108;
  fdb_doc **ppfStack_18100;
  fdb_kvs_handle *pfStack_180f8;
  undefined1 auStack_180e0 [16];
  fdb_kvs_handle *pfStack_180d0;
  fdb_kvs_handle *pfStack_180c8;
  fdb_kvs_handle *pfStack_180c0;
  fdb_kvs_handle *pfStack_180b8;
  fdb_kvs_handle *pfStack_180b0;
  fdb_kvs_config fStack_180a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18090;
  filemgr *pfStack_18088;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18080;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18078;
  filemgr *pfStack_18070;
  fdb_kvs_handle *pfStack_18068;
  timeval tStack_18060;
  undefined1 auStack_18050 [256];
  __atomic_base<unsigned_long> _Stack_17f50;
  timeval tStack_17f48;
  __atomic_base<unsigned_long> _Stack_17f38;
  fdb_doc *apfStack_17ef0 [32];
  char acStack_17df0 [256];
  char acStack_17cf0 [256];
  fdb_kvs_handle afStack_17bf0 [153];
  char acStack_4370 [8];
  fdb_kvs_handle *pfStack_4368;
  fdb_kvs_handle *pfStack_4360;
  fdb_kvs_handle *pfStack_4358;
  fdb_kvs_handle *pfStack_4350;
  fdb_doc **ppfStack_4348;
  fdb_kvs_handle *pfStack_4340;
  fdb_kvs_handle *pfStack_4328;
  fdb_kvs_handle *pfStack_4320;
  fdb_doc *pfStack_4318;
  void *pvStack_4310;
  fdb_kvs_config fStack_4308;
  undefined1 auStack_42f0 [48];
  timeval tStack_42c0;
  undefined1 auStack_42b0 [760];
  char acStack_3fb8 [256];
  fdb_doc *apfStack_3eb8 [101];
  fdb_kvs_handle **ppfStack_3b90;
  fdb_kvs_handle *pfStack_3b88;
  fdb_kvs_handle *pfStack_3b80;
  fdb_kvs_info *pfStack_3b78;
  fdb_doc **ppfStack_3b70;
  fdb_kvs_handle *pfStack_3b68;
  undefined1 auStack_3b50 [16];
  undefined1 auStack_3b40 [24];
  undefined1 auStack_3b28 [32];
  fdb_kvs_handle *apfStack_3b08 [5];
  timeval tStack_3ae0;
  char acStack_3ad0 [256];
  fdb_doc *apfStack_39d0 [31];
  fdb_config fStack_38d8;
  undefined1 auStack_37e0 [752];
  undefined8 auStack_34f0 [31];
  fdb_kvs_handle **ppfStack_33f8;
  fdb_kvs_handle *pfStack_33f0;
  fdb_kvs_handle *pfStack_33e8;
  fdb_kvs_config *pfStack_33e0;
  fdb_doc **ppfStack_33d8;
  fdb_kvs_handle *pfStack_33d0;
  fdb_kvs_handle *pfStack_33b8;
  fdb_kvs_handle *pfStack_33b0;
  fdb_doc *pfStack_33a8;
  fdb_kvs_handle *pfStack_33a0;
  fdb_doc *apfStack_3398 [11];
  timeval tStack_3340;
  fdb_kvs_config fStack_3330;
  char acStack_3318 [256];
  undefined1 auStack_3218 [656];
  fdb_config fStack_2f88;
  fdb_kvs_handle **ppfStack_2e90;
  fdb_kvs_handle *pfStack_2e88;
  fdb_kvs_handle *pfStack_2e80;
  btree *pbStack_2e78;
  btree *pbStack_2e70;
  fdb_kvs_handle *pfStack_2e68;
  fdb_kvs_handle *pfStack_2e58;
  fdb_kvs_handle *pfStack_2e50;
  fdb_file_handle *pfStack_2e48;
  fdb_kvs_handle *pfStack_2e40;
  undefined1 auStack_2e38 [40];
  undefined1 auStack_2e10 [40];
  fdb_file_info fStack_2de8;
  undefined1 auStack_2da0 [768];
  char acStack_2aa0 [264];
  code *pcStack_2998;
  fdb_kvs_handle *pfStack_2990;
  fdb_kvs_handle *pfStack_2988;
  char *pcStack_2980;
  long lStack_2978;
  fdb_kvs_handle *pfStack_2970;
  fdb_snapshot_info_t *pfStack_2958;
  fdb_file_handle *pfStack_2950;
  char *pcStack_2948;
  int iStack_293c;
  undefined1 auStack_2938 [96];
  undefined1 auStack_28d8 [32];
  timeval tStack_28b8;
  fdb_kvs_handle fStack_28a8;
  char acStack_2608 [256];
  fdb_config fStack_2508;
  size_t sStack_2410;
  size_t sStack_2408;
  fdb_doc **ppfStack_2400;
  char *pcStack_23f8;
  code *pcStack_23f0;
  code *pcStack_23e8;
  fdb_file_handle *pfStack_23d0;
  fdb_snapshot_info_t *pfStack_23c8;
  uint64_t uStack_23c0;
  uint uStack_23b4;
  fdb_kvs_handle *apfStack_23b0 [4];
  fdb_kvs_config fStack_2390;
  char acStack_2378 [8];
  timeval tStack_2370;
  char acStack_2360 [256];
  char acStack_2260 [256];
  char acStack_2160 [264];
  fdb_config fStack_2058;
  fdb_doc *apfStack_1f60 [301];
  fdb_kvs_handle **ppfStack_15f8;
  btree *pbStack_15f0;
  fdb_kvs_handle *pfStack_15e8;
  fdb_kvs_handle *pfStack_15e0;
  btree *pbStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  fdb_kvs_handle *pfStack_15b8;
  fdb_iterator *pfStack_15b0;
  fdb_kvs_handle *pfStack_15a8;
  undefined1 auStack_15a0 [16];
  undefined1 auStack_1590 [40];
  btree bStack_1568;
  fdb_kvs_info fStack_1520;
  fdb_config fStack_14f0;
  char acStack_13f8 [256];
  fdb_kvs_handle fStack_12f8;
  fdb_kvs_handle **ppfStack_10f0;
  btree *pbStack_10e8;
  fdb_kvs_handle *pfStack_10e0;
  fdb_kvs_config *pfStack_10d8;
  fdb_file_handle **ppfStack_10d0;
  fdb_kvs_handle *pfStack_10c8;
  fdb_kvs_handle *pfStack_10b8;
  fdb_file_handle *pfStack_10b0;
  fdb_kvs_config fStack_10a8;
  timeval tStack_1090;
  fdb_kvs_info fStack_1080;
  char acStack_1050 [264];
  fdb_config fStack_f48;
  char acStack_e50 [256];
  char acStack_d50 [256];
  fdb_doc *apfStack_c50 [101];
  fdb_kvs_handle **ppfStack_928;
  btree *pbStack_920;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  btree *pbStack_908;
  fdb_kvs_handle *pfStack_900;
  undefined1 local_8e8 [16];
  fdb_kvs_handle *local_8d8;
  fdb_kvs_handle *local_8d0;
  btree_kv_ops *local_8c8;
  undefined1 local_8c0 [40];
  docio_handle *local_898;
  timeval local_860;
  fdb_config local_850;
  btree local_758 [4];
  btree abStack_658 [14];
  fdb_kvs_handle local_338;
  
  pfStack_900 = (fdb_kvs_handle *)0x10cda4;
  gettimeofday(&local_860,(__timezone_ptr_t)0x0);
  pfStack_900 = (fdb_kvs_handle *)0x10cda9;
  memleak_start();
  pfStack_900 = (fdb_kvs_handle *)0x10cdb5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_900 = (fdb_kvs_handle *)0x10cdc5;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)local_8c0;
  pfStack_900 = (fdb_kvs_handle *)0x10cdd2;
  fdb_get_default_kvs_config();
  local_850.buffercache_size = 0x1000000;
  local_850.wal_threshold = 0x400;
  local_850.flags = 1;
  local_850.compaction_threshold = '\0';
  pbVar9 = (btree *)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10ce04;
  fdb_open((fdb_file_handle **)pbVar9,"./compact_test1",&local_850);
  ppfVar18 = (fdb_kvs_handle **)(local_8e8 + 8);
  pfStack_900 = (fdb_kvs_handle *)0x10ce17;
  fdb_kvs_open_default((fdb_file_handle *)local_8e8._0_8_,ppfVar18,(fdb_kvs_config *)pfVar11);
  pfStack_900 = (fdb_kvs_handle *)0x10ce2d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5d7;
  unaff_R12 = (btree *)0x0;
  uVar15 = 0;
  do {
    pfVar1 = &local_338.config.encryption_key;
    pfStack_900 = (fdb_kvs_handle *)0x10ce55;
    sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
    pfStack_900 = (fdb_kvs_handle *)0x10ce6d;
    sprintf((char *)&local_338,"meta%d",uVar15 & 0xffffffff);
    pfStack_900 = (fdb_kvs_handle *)0x10ce85;
    sprintf((char *)local_758,"body%d",uVar15 & 0xffffffff);
    pbVar9 = (btree *)(&abStack_658[0].ksize + (long)unaff_R12);
    pfStack_900 = (fdb_kvs_handle *)0x10ce98;
    pfVar6 = (fdb_kvs_handle *)strlen((char *)pfVar1);
    unaff_RBP = &local_338;
    pfStack_900 = (fdb_kvs_handle *)0x10ceab;
    sVar7 = strlen((char *)unaff_RBP);
    pfStack_900 = (fdb_kvs_handle *)0x10cebb;
    sVar8 = strlen((char *)local_758);
    pfStack_900 = (fdb_kvs_handle *)0x10cee0;
    fdb_doc_create((fdb_doc **)pbVar9,&local_338.config.encryption_key,(size_t)pfVar6,unaff_RBP,
                   sVar7,local_758,sVar8);
    pfStack_900 = (fdb_kvs_handle *)0x10cef2;
    fdb_set((fdb_kvs_handle *)local_8e8._8_8_,*(fdb_doc **)(&abStack_658[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    unaff_R12 = (btree *)((long)unaff_R12 + 8);
  } while (uVar15 != 100);
  pfStack_900 = (fdb_kvs_handle *)0x10cf32;
  fdb_doc_create((fdb_doc **)&local_8d8,*(void **)(abStack_658[0].root_bid + 0x20),
                 *(size_t *)abStack_658[0].root_bid,*(void **)(abStack_658[0].root_bid + 0x38),
                 *(size_t *)(abStack_658[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&local_8d8->file = 1;
  ppfVar18 = (fdb_kvs_handle **)(local_8e8 + 8);
  pfStack_900 = (fdb_kvs_handle *)0x10cf46;
  fdb_set((fdb_kvs_handle *)local_8e8._8_8_,(fdb_doc *)local_8d8);
  pfStack_900 = (fdb_kvs_handle *)0x10cf4e;
  fdb_doc_free((fdb_doc *)local_8d8);
  pfVar11 = (fdb_kvs_handle *)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10cf60;
  fdb_commit((fdb_file_handle *)local_8e8._0_8_,'\x01');
  pfStack_900 = (fdb_kvs_handle *)0x10cf6f;
  fdb_compact((fdb_file_handle *)local_8e8._0_8_,"./compact_test2");
  pfStack_900 = (fdb_kvs_handle *)0x10cf77;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10cf7f;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10cf8b;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_900 = (fdb_kvs_handle *)0x10cfa2;
  fdb_open((fdb_file_handle **)pfVar11,"./compact_test1",&local_850);
  pfStack_900 = (fdb_kvs_handle *)0x10cfb2;
  fdb_kvs_open_default((fdb_file_handle *)local_8e8._0_8_,ppfVar18,(fdb_kvs_config *)local_8c0);
  pfStack_900 = (fdb_kvs_handle *)0x10cfc8;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5dc;
  unaff_R12 = (btree *)0x0;
  unaff_R13 = pfVar6;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10cfff;
    fdb_doc_create((fdb_doc **)&local_8d8,
                   (void *)(*(size_t **)(&abStack_658[0].ksize + (long)unaff_R12 * 8))[4],
                   **(size_t **)(&abStack_658[0].ksize + (long)unaff_R12 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_900 = (fdb_kvs_handle *)0x10d00e;
    fVar4 = fdb_get((fdb_kvs_handle *)local_8e8._8_8_,(fdb_doc *)local_8d8);
    pfVar6 = local_8d8;
    if (unaff_R12 == (btree *)0x1) {
      pfVar6 = unaff_R13;
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d5d2;
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5c2;
      pfVar11 = (fdb_kvs_handle *)local_8d8->staletree;
      unaff_RBP = *(fdb_kvs_handle **)(&abStack_658[0].ksize + (long)unaff_R12 * 8);
      pbVar9 = unaff_RBP->staletree;
      pfStack_900 = (fdb_kvs_handle *)0x10d04a;
      iVar5 = bcmp(pfVar11,pbVar9,(size_t)(local_8d8->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010d5c7;
      pfVar11 = (fdb_kvs_handle *)(pfVar6->field_6).seqtree;
      pbVar9 = (unaff_RBP->field_6).seqtree;
      pfStack_900 = (fdb_kvs_handle *)0x10d069;
      iVar5 = bcmp(pfVar11,pbVar9,(size_t)(pfVar6->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010d5b7;
    }
    pfStack_900 = (fdb_kvs_handle *)0x10d07b;
    fdb_doc_free((fdb_doc *)local_8d8);
    unaff_R12 = (btree *)&unaff_R12->vsize;
    unaff_R13 = pfVar6;
  } while (unaff_R12 != (btree *)0x64);
  pfStack_900 = (fdb_kvs_handle *)0x10d09a;
  fdb_get_file_info((fdb_file_handle *)local_8e8._0_8_,(fdb_file_info *)(local_8c0 + 0x18));
  pfStack_900 = (fdb_kvs_handle *)0x10d0a9;
  iVar5 = strcmp("./compact_test1",(char *)local_8c0._24_8_);
  if (iVar5 != 0) {
    pfStack_900 = (fdb_kvs_handle *)0x10d0b7;
    compact_with_reopen_test();
  }
  pfVar11 = &local_338;
  unaff_R12 = local_758;
  pfVar6 = (fdb_kvs_handle *)0x0;
  uVar15 = 0;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d0df;
    sprintf((char *)pfVar11,"newmeta%d",uVar15 & 0xffffffff);
    pfStack_900 = (fdb_kvs_handle *)0x10d0fa;
    sprintf((char *)unaff_R12,"newbody%d_%s",uVar15 & 0xffffffff,&local_338.bub_ctx.handle);
    pfStack_900 = (fdb_kvs_handle *)0x10d10d;
    pbVar9 = (btree *)strlen((char *)pfVar11);
    pfStack_900 = (fdb_kvs_handle *)0x10d118;
    sVar7 = strlen((char *)unaff_R12);
    pfStack_900 = (fdb_kvs_handle *)0x10d12c;
    fdb_doc_update((fdb_doc **)(&abStack_658[0].ksize + (long)pfVar6),pfVar11,(size_t)pbVar9,
                   unaff_R12,sVar7);
    pfStack_900 = (fdb_kvs_handle *)0x10d13e;
    fdb_set((fdb_kvs_handle *)local_8e8._8_8_,*(fdb_doc **)(&abStack_658[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    pfVar6 = (fdb_kvs_handle *)((long)pfVar6 + 8);
  } while (uVar15 != 100);
  pfStack_900 = (fdb_kvs_handle *)0x10d167;
  fdb_open((fdb_file_handle **)&local_8c8,"./compact_test1",&local_850);
  ppfVar18 = &local_8d0;
  pfStack_900 = (fdb_kvs_handle *)0x10d17c;
  fdb_kvs_open_default((fdb_file_handle *)local_8c8,ppfVar18,(fdb_kvs_config *)local_8c0);
  pfStack_900 = (fdb_kvs_handle *)0x10d192;
  fVar4 = fdb_set_log_callback(local_8d0,logCallbackFunc,"compact_with_reopen_test");
  unaff_RBP = (fdb_kvs_handle *)0x64;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e1;
  pfStack_900 = (fdb_kvs_handle *)0x10d1a6;
  fVar4 = fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e6;
  pfStack_900 = (fdb_kvs_handle *)0x10d1ba;
  fVar4 = fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5eb;
  pfStack_900 = (fdb_kvs_handle *)0x10d1ce;
  fVar4 = fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5f0;
  pfStack_900 = (fdb_kvs_handle *)0x10d1e0;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d1ea;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfVar6 = (fdb_kvs_handle *)0x0;
  ppfVar18 = &local_8d8;
  pfVar14 = pfVar11;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d219;
    fdb_doc_create((fdb_doc **)ppfVar18,
                   (void *)(*(size_t **)(&abStack_658[0].ksize + (long)pfVar6 * 8))[4],
                   **(size_t **)(&abStack_658[0].ksize + (long)pfVar6 * 8),(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_900 = (fdb_kvs_handle *)0x10d228;
    fVar4 = fdb_get(local_8d0,(fdb_doc *)local_8d8);
    pfVar11 = local_8d8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_900 = (fdb_kvs_handle *)0x10d586;
      compact_with_reopen_test();
LAB_0010d586:
      pfStack_900 = (fdb_kvs_handle *)0x10d591;
      compact_with_reopen_test();
LAB_0010d591:
      pfStack_900 = (fdb_kvs_handle *)0x10d59c;
      compact_with_reopen_test();
      goto LAB_0010d59c;
    }
    pbVar9 = local_8d8->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_658[0].ksize + (long)pfVar6 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_900 = (fdb_kvs_handle *)0x10d254;
    iVar5 = bcmp(pbVar9,unaff_R12,(size_t)(local_8d8->kvs_config).custom_cmp);
    pfVar14 = pfVar11;
    if (iVar5 != 0) goto LAB_0010d586;
    pbVar9 = (pfVar11->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_900 = (fdb_kvs_handle *)0x10d273;
    iVar5 = bcmp(pbVar9,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d591;
    pfStack_900 = (fdb_kvs_handle *)0x10d283;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
  } while (pfVar6 != (fdb_kvs_handle *)0x64);
  pfStack_900 = (fdb_kvs_handle *)0x10d2a9;
  fVar4 = fdb_open((fdb_file_handle **)local_8e8,"./compact_test1",&local_850);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5f5;
  pfStack_900 = (fdb_kvs_handle *)0x10d2c5;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)local_8e8._0_8_,(fdb_kvs_handle **)(local_8e8 + 8),
                     (fdb_kvs_config *)local_8c0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5fa;
  pfStack_900 = (fdb_kvs_handle *)0x10d2e5;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5ff;
  pfStack_900 = (fdb_kvs_handle *)0x10d2ff;
  fdb_get_file_info((fdb_file_handle *)local_8e8._0_8_,(fdb_file_info *)(local_8c0 + 0x18));
  pfStack_900 = (fdb_kvs_handle *)0x10d30e;
  iVar5 = strcmp("./compact_test1.3",(char *)local_8c0._24_8_);
  if (iVar5 != 0) {
    pfStack_900 = (fdb_kvs_handle *)0x10d31c;
    compact_with_reopen_test();
  }
  pfStack_900 = (fdb_kvs_handle *)0x10d326;
  fdb_kvs_close(local_8d0);
  pfStack_900 = (fdb_kvs_handle *)0x10d330;
  fdb_close((fdb_file_handle *)local_8c8);
  pfVar6 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d35f;
    fdb_doc_create((fdb_doc **)&local_8d8,
                   (void *)(*(size_t **)(&abStack_658[0].ksize + (long)pfVar6 * 8))[4],
                   **(size_t **)(&abStack_658[0].ksize + (long)pfVar6 * 8),(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_900 = (fdb_kvs_handle *)0x10d36e;
    fVar4 = fdb_get((fdb_kvs_handle *)local_8e8._8_8_,(fdb_doc *)local_8d8);
    pfVar11 = local_8d8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d59c;
    pbVar9 = local_8d8->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_658[0].ksize + (long)pfVar6 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_900 = (fdb_kvs_handle *)0x10d39a;
    iVar5 = bcmp(pbVar9,unaff_R12,(size_t)(local_8d8->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0010d5a1;
    pbVar9 = (pfVar11->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_900 = (fdb_kvs_handle *)0x10d3b9;
    iVar5 = bcmp(pbVar9,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5ac;
    pfStack_900 = (fdb_kvs_handle *)0x10d3c9;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
    pfVar14 = pfVar11;
  } while (pfVar6 != (fdb_kvs_handle *)0x64);
  ppfVar18 = (fdb_kvs_handle **)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10d3e5;
  fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  pfVar11 = (fdb_kvs_handle *)(local_8e8 + 8);
  pfStack_900 = (fdb_kvs_handle *)0x10d3f2;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d3fa;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d406;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_900 = (fdb_kvs_handle *)0x10d41d;
  fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&local_850);
  pfStack_900 = (fdb_kvs_handle *)0x10d42d;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_8e8._0_8_,(fdb_kvs_handle **)pfVar11,
             (fdb_kvs_config *)local_8c0);
  pfStack_900 = (fdb_kvs_handle *)0x10d443;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d604;
  ppfVar18 = (fdb_kvs_handle **)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10d45a;
  fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  pfStack_900 = (fdb_kvs_handle *)0x10d464;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d46c;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d483;
  fVar4 = fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&local_850);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d609;
  pfStack_900 = (fdb_kvs_handle *)0x10d49f;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)local_8e8._0_8_,(fdb_kvs_handle **)(local_8e8 + 8),
                     (fdb_kvs_config *)local_8c0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d60e;
  pfStack_900 = (fdb_kvs_handle *)0x10d4bf;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_900 = (fdb_kvs_handle *)0x10d4d9;
    fdb_get_file_info((fdb_file_handle *)local_8e8._0_8_,(fdb_file_info *)(local_8c0 + 0x18));
    pfStack_900 = (fdb_kvs_handle *)0x10d4e8;
    iVar5 = strcmp("./compact_test.fdb",(char *)local_8c0._24_8_);
    if (iVar5 != 0) {
      pfStack_900 = (fdb_kvs_handle *)0x10d4f6;
      compact_with_reopen_test();
    }
    if (local_898 != (docio_handle *)0x64) {
      pfStack_900 = (fdb_kvs_handle *)0x10d508;
      compact_with_reopen_test();
    }
    lVar28 = 0;
    do {
      pfStack_900 = (fdb_kvs_handle *)0x10d517;
      fdb_doc_free(*(fdb_doc **)(&abStack_658[0].ksize + lVar28 * 8));
      lVar28 = lVar28 + 1;
    } while (lVar28 != 100);
    pfStack_900 = (fdb_kvs_handle *)0x10d52a;
    fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
    pfStack_900 = (fdb_kvs_handle *)0x10d534;
    fdb_close((fdb_file_handle *)local_8e8._0_8_);
    pfStack_900 = (fdb_kvs_handle *)0x10d539;
    fdb_shutdown();
    pfStack_900 = (fdb_kvs_handle *)0x10d53e;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_900 = (fdb_kvs_handle *)0x10d56f;
    fprintf(_stderr,pcVar23,"compaction with reopen test");
    return;
  }
  goto LAB_0010d613;
LAB_0010eacf:
  pfStack_2970 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
  goto LAB_0010ead4;
LAB_001107eb:
  pfStack_180f8 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar11 = pfVar22;
LAB_001107f6:
  pfVar22 = pfVar11;
  pfStack_180f8 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_180f8 = (fdb_kvs_handle *)0x110806;
  pcVar23 = (char *)pfVar14;
  compaction_daemon_test();
  pfVar11 = pfVar22;
LAB_00110806:
  _Var34._M_i = (__int_type_conflict)apfStack_17ef0;
  pcVar20 = "key%04d";
  pfStack_180f8 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_0010d59c:
  pfVar11 = pfVar14;
  pfStack_900 = (fdb_kvs_handle *)0x10d5a1;
  compact_with_reopen_test();
LAB_0010d5a1:
  pfStack_900 = (fdb_kvs_handle *)0x10d5ac;
  compact_with_reopen_test();
LAB_0010d5ac:
  pfStack_900 = (fdb_kvs_handle *)0x10d5b7;
  compact_with_reopen_test();
LAB_0010d5b7:
  pfStack_900 = (fdb_kvs_handle *)0x10d5c2;
  compact_with_reopen_test();
  unaff_R13 = pfVar6;
LAB_0010d5c2:
  pfVar6 = unaff_R13;
  pfStack_900 = (fdb_kvs_handle *)0x10d5c7;
  compact_with_reopen_test();
LAB_0010d5c7:
  pfStack_900 = (fdb_kvs_handle *)0x10d5d2;
  compact_with_reopen_test();
  unaff_R13 = pfVar6;
LAB_0010d5d2:
  ppfVar18 = &local_8d8;
  pfStack_900 = (fdb_kvs_handle *)0x10d5d7;
  compact_with_reopen_test();
LAB_0010d5d7:
  pfStack_900 = (fdb_kvs_handle *)0x10d5dc;
  compact_with_reopen_test();
  pfVar6 = unaff_R13;
LAB_0010d5dc:
  pfStack_900 = (fdb_kvs_handle *)0x10d5e1;
  compact_with_reopen_test();
LAB_0010d5e1:
  pfStack_900 = (fdb_kvs_handle *)0x10d5e6;
  compact_with_reopen_test();
LAB_0010d5e6:
  pfStack_900 = (fdb_kvs_handle *)0x10d5eb;
  compact_with_reopen_test();
LAB_0010d5eb:
  pfStack_900 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_900 = (fdb_kvs_handle *)0x10d5f5;
  compact_with_reopen_test();
LAB_0010d5f5:
  pfStack_900 = (fdb_kvs_handle *)0x10d5fa;
  compact_with_reopen_test();
LAB_0010d5fa:
  pfStack_900 = (fdb_kvs_handle *)0x10d5ff;
  compact_with_reopen_test();
LAB_0010d5ff:
  pfStack_900 = (fdb_kvs_handle *)0x10d604;
  compact_with_reopen_test();
LAB_0010d604:
  pfStack_900 = (fdb_kvs_handle *)0x10d609;
  compact_with_reopen_test();
LAB_0010d609:
  pfStack_900 = (fdb_kvs_handle *)0x10d60e;
  compact_with_reopen_test();
LAB_0010d60e:
  pfStack_900 = (fdb_kvs_handle *)0x10d613;
  compact_with_reopen_test();
LAB_0010d613:
  pfStack_900 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_10c8 = (fdb_kvs_handle *)0x10d635;
  ppfStack_928 = ppfVar18;
  pbStack_920 = unaff_R12;
  pfStack_918 = pfVar6;
  pfStack_910 = pfVar11;
  pbStack_908 = pbVar9;
  pfStack_900 = unaff_RBP;
  gettimeofday(&tStack_1090,(__timezone_ptr_t)0x0);
  pfStack_10c8 = (fdb_kvs_handle *)0x10d63a;
  memleak_start();
  pfStack_10c8 = (fdb_kvs_handle *)0x10d646;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_10c8 = (fdb_kvs_handle *)0x10d656;
  fdb_get_default_config();
  pfStack_10c8 = (fdb_kvs_handle *)0x10d663;
  fdb_get_default_kvs_config();
  fStack_f48.wal_threshold = 0x400;
  fStack_f48.flags = 1;
  fStack_f48.compaction_threshold = '\0';
  pfStack_10c8 = (fdb_kvs_handle *)0x10d68d;
  fdb_open(&pfStack_10b0,"./compact_test1",&fStack_f48);
  pfStack_10c8 = (fdb_kvs_handle *)0x10d6a7;
  fdb_kvs_open(pfStack_10b0,&pfStack_10b8,"db",&fStack_10a8);
  pfStack_10c8 = (fdb_kvs_handle *)0x10d6bd;
  fVar4 = fdb_set_log_callback(pfStack_10b8,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar15 = 0;
    do {
      pfStack_10c8 = (fdb_kvs_handle *)0x10d6e5;
      sprintf(acStack_d50,"key%d",uVar15 & 0xffffffff);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d6fd;
      sprintf(acStack_e50,"meta%d",uVar15 & 0xffffffff);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d712;
      sprintf(acStack_1050,"body%d",uVar15 & 0xffffffff);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d725;
      sVar7 = strlen(acStack_d50);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d738;
      sVar8 = strlen(acStack_e50);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d745;
      sVar10 = strlen(acStack_1050);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d767;
      fdb_doc_create((fdb_doc **)((long)apfStack_c50 + lVar28),acStack_d50,sVar7,acStack_e50,sVar8,
                     acStack_1050,sVar10);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d779;
      fdb_set(pfStack_10b8,apfStack_c50[uVar15]);
      uVar15 = uVar15 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar15 != 100);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d799;
    fdb_commit(pfStack_10b0,'\0');
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7a3;
    fdb_compact(pfStack_10b0,(char *)0x0);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7b9;
    fdb_get_kvs_info(pfStack_10b8,&fStack_1080);
    lVar28 = (long)(int)fStack_1080.doc_count;
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7c6;
    fdb_kvs_close(pfStack_10b8);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7ce;
    fdb_close(pfStack_10b0);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7e5;
    fdb_open(&pfStack_10b0,"./compact_test1",&fStack_f48);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7fc;
    fdb_kvs_open(pfStack_10b0,&pfStack_10b8,"db",&fStack_10a8);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d808;
    fdb_get_kvs_info(pfStack_10b8,&fStack_1080);
    if (lVar28 != CONCAT44(fStack_1080.doc_count._4_4_,(int)fStack_1080.doc_count)) {
      pfStack_10c8 = (fdb_kvs_handle *)0x10d81b;
      compact_reopen_named_kvs();
    }
    pfStack_10c8 = (fdb_kvs_handle *)0x10d825;
    fdb_kvs_close(pfStack_10b8);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d82f;
    fdb_close(pfStack_10b0);
    lVar28 = 0;
    do {
      pfStack_10c8 = (fdb_kvs_handle *)0x10d83e;
      fdb_doc_free(apfStack_c50[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 100);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d84c;
    fdb_shutdown();
    pfStack_10c8 = (fdb_kvs_handle *)0x10d851;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_10c8 = (fdb_kvs_handle *)0x10d882;
    fprintf(_stderr,pcVar23,"compact reopen named kvs");
    return;
  }
  pfStack_10c8 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8b6;
  ppfStack_10f0 = &pfStack_10b8;
  pbStack_10e8 = unaff_R12;
  pfStack_10e0 = pfVar6;
  pfStack_10d8 = &fStack_10a8;
  ppfStack_10d0 = &pfStack_10b0;
  pfStack_10c8 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1590 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8bb;
  memleak_start();
  pfStack_15a8 = (fdb_kvs_handle *)0x0;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8d0;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8e0;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_1590;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8ed;
  fdb_get_default_kvs_config();
  fStack_14f0.wal_threshold = 0x400;
  fStack_14f0.flags = 1;
  fStack_14f0.compaction_threshold = '\0';
  pbVar9 = (btree *)auStack_15a0;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d917;
  fdb_open((fdb_file_handle **)pbVar9,"./compact_test1",&fStack_14f0);
  ppfVar18 = &pfStack_15b8;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d931;
  fdb_kvs_open((fdb_file_handle *)auStack_15a0._0_8_,ppfVar18,"db",(fdb_kvs_config *)pfVar11);
  pfStack_15d0 = (fdb_kvs_handle *)0x10d947;
  pfVar14 = pfStack_15b8;
  fVar4 = fdb_set_log_callback(pfStack_15b8,logCallbackFunc,"compact_reopen_with_iterator");
  uVar27 = (uint)pfVar14;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (btree *)0x0;
    uVar15 = 0;
    do {
      pfVar1 = &fStack_12f8.config.encryption_key;
      pfStack_15d0 = (fdb_kvs_handle *)0x10d96f;
      sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d987;
      sprintf((char *)&fStack_12f8,"meta%d",uVar15 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d99f;
      sprintf(acStack_13f8,"body%d",uVar15 & 0xffffffff);
      pbVar9 = (btree *)(&bStack_1568.ksize + (long)unaff_R12);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9af;
      pfVar6 = (fdb_kvs_handle *)strlen((char *)pfVar1);
      unaff_RBP = &fStack_12f8;
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9c2;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9d2;
      sVar7 = strlen(acStack_13f8);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9f7;
      fdb_doc_create((fdb_doc **)pbVar9,&fStack_12f8.config.encryption_key,(size_t)pfVar6,unaff_RBP,
                     (size_t)pfVar11,acStack_13f8,sVar7);
      pfStack_15d0 = (fdb_kvs_handle *)0x10da06;
      fdb_set(pfStack_15b8,*(fdb_doc **)(&bStack_1568.ksize + uVar15 * 8));
      uVar15 = uVar15 + 1;
      unaff_R12 = (btree *)((long)unaff_R12 + 8);
    } while (uVar15 != 9);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da23;
    fdb_commit((fdb_file_handle *)auStack_15a0._0_8_,'\0');
    ppfVar18 = (fdb_kvs_handle **)(auStack_15a0 + 8);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da3f;
    fdb_open((fdb_file_handle **)ppfVar18,"./compact_test1",&fStack_14f0);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da4e;
    pfVar24 = (fdb_file_handle *)auStack_15a0._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_15a0._8_8_,"./compact_test2");
    uVar27 = (uint)pfVar24;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dc71;
    pfStack_15d0 = (fdb_kvs_handle *)0x10da60;
    fdb_close((fdb_file_handle *)auStack_15a0._8_8_);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da80;
    pfVar14 = pfStack_15b8;
    fVar4 = fdb_iterator_init(pfStack_15b8,&pfStack_15b0,(void *)0x0,0,(void *)0x0,0,0);
    uVar27 = (uint)pfVar14;
    pfVar14 = pfVar11;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dc76;
    pfVar6 = (fdb_kvs_handle *)0x0;
    ppfVar18 = &pfStack_15a8;
    do {
      pfStack_15d0 = (fdb_kvs_handle *)0x10da9d;
      fVar4 = fdb_iterator_get(pfStack_15b0,(fdb_doc **)ppfVar18);
      pfVar14 = pfStack_15a8;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0010dc51:
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc56;
        compact_reopen_with_iterator();
LAB_0010dc56:
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc61;
        compact_reopen_with_iterator();
LAB_0010dc61:
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc6c;
        pbVar26 = unaff_R12;
        compact_reopen_with_iterator();
        uVar27 = (uint)pbVar26;
        goto LAB_0010dc6c;
      }
      pbVar9 = (btree *)pfStack_15a8->op_stats;
      unaff_RBP = *(fdb_kvs_handle **)(&bStack_1568.ksize + (long)pfVar6 * 8);
      unaff_R12 = (btree *)unaff_RBP->op_stats;
      pfStack_15d0 = (fdb_kvs_handle *)0x10dac5;
      iVar5 = bcmp(pbVar9,unaff_R12,*(size_t *)&pfStack_15a8->kvs_config);
      pfVar11 = pfVar14;
      if (iVar5 != 0) {
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc51;
        compact_reopen_with_iterator();
        goto LAB_0010dc51;
      }
      pbVar9 = pfVar14->staletree;
      unaff_R12 = unaff_RBP->staletree;
      pfStack_15d0 = (fdb_kvs_handle *)0x10dae4;
      iVar5 = bcmp(pbVar9,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010dc61;
      pbVar9 = (pfVar14->field_6).seqtree;
      unaff_R12 = (unaff_RBP->field_6).seqtree;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db03;
      iVar5 = bcmp(pbVar9,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010dc56;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db13;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_15a8 = (fdb_kvs_handle *)0x0;
      pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db29;
      pfVar25 = pfStack_15b0;
      fVar4 = fdb_iterator_next(pfStack_15b0);
      uVar27 = (uint)pfVar25;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)pfVar6 != 9) goto LAB_0010dc7b;
    pfStack_15d0 = (fdb_kvs_handle *)0x10db46;
    fVar4 = fdb_iterator_close(pfStack_15b0);
    uVar27 = (uint)pfStack_15b0;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_15d0 = (fdb_kvs_handle *)0x10db66;
      fdb_get_kvs_info(pfStack_15b8,&fStack_1520);
      lVar28 = (long)(int)fStack_1520.doc_count;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db72;
      fdb_kvs_close(pfStack_15b8);
      pfStack_15d0 = (fdb_kvs_handle *)0x10db80;
      fdb_close((fdb_file_handle *)auStack_15a0._0_8_);
      pfStack_15d0 = (fdb_kvs_handle *)0x10db97;
      fdb_open((fdb_file_handle **)auStack_15a0,"./compact_test2",&fStack_14f0);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbaf;
      fdb_kvs_open((fdb_file_handle *)auStack_15a0._0_8_,&pfStack_15b8,"db",
                   (fdb_kvs_config *)auStack_1590);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbba;
      fdb_get_kvs_info(pfStack_15b8,&fStack_1520);
      if (lVar28 != CONCAT44(fStack_1520.doc_count._4_4_,(int)fStack_1520.doc_count)) {
        pfStack_15d0 = (fdb_kvs_handle *)0x10dbd0;
        compact_reopen_with_iterator();
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbda;
      fdb_kvs_close(pfStack_15b8);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbe4;
      fdb_close((fdb_file_handle *)auStack_15a0._0_8_);
      lVar28 = 0;
      do {
        pfStack_15d0 = (fdb_kvs_handle *)0x10dbf0;
        fdb_doc_free(*(fdb_doc **)(&bStack_1568.ksize + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 9);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbfe;
      fdb_shutdown();
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc03;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc34;
      fprintf(_stderr,pcVar23,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dc6c:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dc71;
    compact_reopen_with_iterator();
LAB_0010dc71:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dc76;
    compact_reopen_with_iterator();
    pfVar14 = pfVar11;
LAB_0010dc76:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dc7b;
    compact_reopen_with_iterator();
LAB_0010dc7b:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dc80;
    compact_reopen_with_iterator();
  }
  pfStack_15d0 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_23e8 = (code *)0x10dca7;
  ppfStack_15f8 = ppfVar18;
  pbStack_15f0 = unaff_R12;
  pfStack_15e8 = pfVar6;
  pfStack_15e0 = pfVar14;
  pbStack_15d8 = pbVar9;
  pfStack_15d0 = unaff_RBP;
  gettimeofday(&tStack_2370,(__timezone_ptr_t)0x0);
  pcStack_23e8 = (code *)0x10dcac;
  memleak_start();
  pcStack_23e8 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_23e8 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  fStack_2058.buffercache_size = 0;
  fStack_2058.wal_threshold = 0x32;
  fStack_2058.flags = 1;
  fStack_2058.compaction_threshold = '\0';
  fStack_2058.block_reusing_threshold = 0;
  pcStack_23e8 = (code *)0x10dcf4;
  fStack_2058.multi_kv_instances = (bool)(char)uVar27;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_23e8 = (code *)0x10dd08;
  fdb_open(&pfStack_23d0,"./compact_test1",&fStack_2058);
  uStack_23b4 = uVar27;
  if (uVar27 == 0) {
    pcStack_23e8 = (code *)0x10dd74;
    fdb_kvs_open_default(pfStack_23d0,apfStack_23b0,&fStack_2390);
    sVar16 = 1;
  }
  else {
    ppfVar18 = apfStack_23b0;
    uVar15 = 0;
    do {
      pcStack_23e8 = (code *)0x10dd39;
      sprintf(acStack_2378,"kv%d",uVar15 & 0xffffffff);
      pcStack_23e8 = (code *)0x10dd4c;
      fdb_kvs_open(pfStack_23d0,ppfVar18,acStack_2378,&fStack_2390);
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    sVar16 = 4;
  }
  uVar15 = 0;
  do {
    pcStack_23e8 = (code *)0x10dd98;
    sprintf(acStack_2160,"key%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10ddb1;
    sprintf(acStack_2260,"meta%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10ddca;
    sprintf(acStack_2360,"body%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10dddd;
    sVar7 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10ddf0;
    sVar8 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10de00;
    sVar10 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10de25;
    fdb_doc_create(apfStack_1f60 + uVar15,acStack_2160,sVar7,acStack_2260,sVar8,acStack_2360,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10de36;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x4b);
  pcStack_23e8 = (code *)0x10de5a;
  fdb_commit(pfStack_23d0,'\x01');
  uVar15 = 0x4b;
  do {
    pcStack_23e8 = (code *)0x10de7c;
    sprintf(acStack_2160,"key%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10de95;
    sprintf(acStack_2260,"meta%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10deae;
    sprintf(acStack_2360,"body%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10dec1;
    sVar7 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10ded4;
    sVar8 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10dee4;
    sVar10 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10df09;
    fdb_doc_create(apfStack_1f60 + uVar15,acStack_2160,sVar7,acStack_2260,sVar8,acStack_2360,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10df1a;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x96);
  lVar28 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10df4a;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[lVar28]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x4b);
  lVar28 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10df73;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[lVar28]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x4b);
  pcStack_23e8 = (code *)0x10df90;
  fdb_commit(pfStack_23d0,'\0');
  uVar15 = 0x96;
  do {
    pcStack_23e8 = (code *)0x10dfb2;
    sprintf(acStack_2160,"key%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10dfcb;
    sprintf(acStack_2260,"meta%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10dfe4;
    sprintf(acStack_2360,"body%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10dff7;
    sVar7 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10e00a;
    sVar8 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10e01a;
    sVar10 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10e03f;
    fdb_doc_create(apfStack_1f60 + uVar15,acStack_2160,sVar7,acStack_2260,sVar8,acStack_2360,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10e050;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xe1);
  pcStack_23e8 = (code *)0x10e077;
  fdb_commit(pfStack_23d0,'\x01');
  uVar15 = 0xe1;
  do {
    pcStack_23e8 = (code *)0x10e099;
    sprintf(acStack_2160,"key%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e0b2;
    sprintf(acStack_2260,"meta%d",uVar15 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e0cb;
    sprintf(acStack_2360,"body%d",uVar15 & 0xffffffff);
    ppfVar33 = apfStack_1f60 + uVar15;
    pcStack_23e8 = (code *)0x10e0de;
    sVar7 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10e0f1;
    sVar8 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10e101;
    sVar10 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10e126;
    fdb_doc_create(ppfVar33,acStack_2160,sVar7,acStack_2260,sVar8,acStack_2360,sVar10);
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10e137;
      fdb_set(apfStack_23b0[sVar32],*ppfVar33);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 300);
  sVar32 = 0;
  pcStack_23e8 = (code *)0x10e15e;
  fdb_commit(pfStack_23d0,'\0');
  do {
    pfVar11 = apfStack_23b0[sVar32];
    pcStack_23e8 = (code *)0x10e17c;
    fVar4 = fdb_set_log_callback(pfVar11,logCallbackFunc,"estimate_space_upto_test");
    iVar5 = (int)pfVar11;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_23e8 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar32 = sVar32 + 1;
  } while (sVar16 != sVar32);
  pcStack_23e8 = (code *)0x10e1a0;
  pfVar24 = pfStack_23d0;
  fVar4 = fdb_get_all_snap_markers(pfStack_23d0,&pfStack_23c8,&uStack_23c0);
  iVar5 = (int)pfVar24;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    sVar7 = (size_t)uStack_23b4;
    cVar21 = (char)uStack_23b4;
    uVar13 = uStack_23c0;
    if (cVar21 != '\0') {
      if (uStack_23c0 != 8) {
        pcStack_23e8 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_23e8 = (code *)0x10e1d9;
      sVar16 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[1].marker);
      pcStack_23e8 = (code *)0x10e1ef;
      sVar12 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[2].marker);
      if (sVar12 <= sVar16) {
        pcStack_23e8 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar13 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_23e8 = (code *)0x10e24a;
      fVar4 = fdb_free_snap_markers(pfStack_23c8,uStack_23c0);
      iVar5 = (int)pfStack_23c8;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcStack_23e8 = (code *)0x10e25c;
        fdb_close(pfStack_23d0);
        lVar28 = 0;
        do {
          pcStack_23e8 = (code *)0x10e26b;
          fdb_doc_free(apfStack_1f60[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 300);
        pcStack_23e8 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_23e8 = (code *)0x10e281;
        memleak_end();
        pcVar23 = "single kv mode:";
        if (cVar21 != '\0') {
          pcVar23 = "multiple kv mode:";
        }
        pcStack_23e8 = (code *)0x10e2af;
        sprintf(acStack_2360,"estimate space upto marker in file test %s",pcVar23);
        pcVar23 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStack_23e8 = (code *)0x10e2dc;
        fprintf(_stderr,pcVar23,acStack_2360);
        return;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar13 != 4) {
      pcStack_23e8 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_23e8 = (code *)0x10e21c;
    sVar16 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[1].marker);
    pcStack_23e8 = (code *)0x10e232;
    pfVar24 = pfStack_23d0;
    sVar12 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[2].marker);
    iVar5 = (int)pfVar24;
    if (sVar16 < sVar12) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_23e8 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_23e8 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_23e8 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_23f0 = logCallbackFunc;
  pcStack_23f8 = "estimate_space_upto_test";
  pfStack_2970 = (fdb_kvs_handle *)0x10e327;
  sStack_2410 = sVar16;
  sStack_2408 = sVar32;
  ppfStack_2400 = ppfVar33;
  pcStack_23e8 = (code *)sVar7;
  gettimeofday(&tStack_28b8,(__timezone_ptr_t)0x0);
  pfStack_2970 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_2970 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_2970 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_2508.buffercache_size = 0;
  fStack_2508.wal_threshold = 0x400;
  fStack_2508.flags = 1;
  fStack_2508.compaction_threshold = '\0';
  fStack_2508.block_reusing_threshold = 0;
  pfStack_2970 = (fdb_kvs_handle *)0x10e374;
  fStack_2508.multi_kv_instances = (bool)(char)iVar5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2970 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_2950,"./compact_test1",&fStack_2508);
  iStack_293c = iVar5;
  if (iVar5 == 0) {
    pfStack_2970 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_2950,(fdb_kvs_handle **)(auStack_2938 + 0x20),
               (fdb_kvs_config *)(auStack_2938 + 0x48));
    uVar27 = 1;
  }
  else {
    ppfVar18 = (fdb_kvs_handle **)(auStack_2938 + 0x20);
    uVar15 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_2938,"kv%d",uVar15 & 0xffffffff);
      pfStack_2970 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_2950,ppfVar18,auStack_2938,(fdb_kvs_config *)(auStack_2938 + 0x48));
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    uVar27 = 4;
  }
  pfVar11 = (fdb_kvs_handle *)(ulong)uVar27;
  uVar15 = 0;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_28a8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_28a8.config.compaction_minimum_filesize,"meta%d",uVar15 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_2608,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_28a8.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2970 = (fdb_kvs_handle *)0x10e45f;
    sVar7 = strlen((char *)&fStack_28a8.kv_info_offset);
    puVar2 = &fStack_28a8.config.compaction_minimum_filesize;
    pfStack_2970 = (fdb_kvs_handle *)0x10e472;
    sVar8 = strlen((char *)puVar2);
    pfStack_2970 = (fdb_kvs_handle *)0x10e482;
    sVar10 = strlen(acStack_2608);
    pfStack_2970 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_28a8.kv_info_offset,sVar7,puVar2,sVar8,acStack_2608,
                   sVar10);
    lVar28 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  pfStack_2970 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_2950,'\x01');
  uVar15 = 5;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_28a8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_28a8.config.compaction_minimum_filesize;
    pfStack_2970 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_2608,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_28a8.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2970 = (fdb_kvs_handle *)0x10e549;
    sVar7 = strlen((char *)&fStack_28a8.kv_info_offset);
    pfStack_2970 = (fdb_kvs_handle *)0x10e554;
    sVar8 = strlen((char *)puVar2);
    pfStack_2970 = (fdb_kvs_handle *)0x10e55f;
    sVar10 = strlen(acStack_2608);
    pfStack_2970 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_28a8.kv_info_offset,sVar7,
                   &fStack_28a8.config.compaction_minimum_filesize,sVar8,acStack_2608,sVar10);
    lVar28 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfStack_2970 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_2950,'\0');
  uVar15 = 10;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_28a8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_28a8.config.compaction_minimum_filesize;
    pfStack_2970 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_2608,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_28a8.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2970 = (fdb_kvs_handle *)0x10e622;
    sVar7 = strlen((char *)&fStack_28a8.kv_info_offset);
    pfStack_2970 = (fdb_kvs_handle *)0x10e62d;
    sVar8 = strlen((char *)puVar2);
    pfStack_2970 = (fdb_kvs_handle *)0x10e638;
    sVar10 = strlen(acStack_2608);
    pfStack_2970 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_28a8.kv_info_offset,sVar7,
                   &fStack_28a8.config.compaction_minimum_filesize,sVar8,acStack_2608,sVar10);
    lVar28 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xf);
  pfStack_2970 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_2950,'\x01');
  uVar15 = 0xf;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_28a8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_28a8.config.compaction_minimum_filesize;
    pfStack_2970 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_2608,"body%d",uVar15 & 0xffffffff);
    pfVar6 = (fdb_kvs_handle *)(&fStack_28a8.kvs_config.create_if_missing + uVar15 * 8);
    pfStack_2970 = (fdb_kvs_handle *)0x10e6fe;
    sVar7 = strlen((char *)&fStack_28a8.kv_info_offset);
    pfStack_2970 = (fdb_kvs_handle *)0x10e709;
    pfVar14 = (fdb_kvs_handle *)strlen((char *)puVar2);
    pfStack_2970 = (fdb_kvs_handle *)0x10e714;
    sVar8 = strlen(acStack_2608);
    pfStack_2970 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)pfVar6,&fStack_28a8.kv_info_offset,sVar7,
                   &fStack_28a8.config.compaction_minimum_filesize,(size_t)pfVar14,acStack_2608,
                   sVar8);
    lVar28 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar28 * 8 + 0x20),
              *(fdb_doc **)&pfVar6->kvs_config);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x14);
  lVar28 = 0;
  pfStack_2970 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_2950,'\0');
  __s = logCallbackFunc;
  pcVar23 = "compact_upto_test";
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e78b;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2938 + lVar28 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar28 = lVar28 + 1;
  } while (pfVar11 != (fdb_kvs_handle *)lVar28);
  pfStack_2970 = (fdb_kvs_handle *)0x10e7af;
  fVar4 = fdb_get_all_snap_markers(pfStack_2950,&pfStack_2958,(uint64_t *)&pcStack_2948);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_293c == '\0') {
      if (pcStack_2948 != (char *)0x4) {
        pfStack_2970 = (fdb_kvs_handle *)0x10e8c9;
        compact_upto_test();
      }
      if (pcStack_2948 != (char *)0x0) {
        lVar28 = 0x1400000000;
        pfVar14 = (fdb_kvs_handle *)0x0;
        pfVar6 = (fdb_kvs_handle *)0xfffffffb00000000;
        pcVar23 = (char *)0x0;
        do {
          if (*(long *)((long)&pfStack_2958->num_kvs_markers + (long)pfVar14) != 1) {
            pfStack_2970 = (fdb_kvs_handle *)0x10eab6;
            compact_upto_test();
          }
          if (*(long *)(*(long *)((long)&pfStack_2958->kvs_markers + (long)pfVar14) + 8) !=
              lVar28 >> 0x20) {
            pfStack_2970 = (fdb_kvs_handle *)0x10eac3;
            compact_upto_test();
          }
          pcVar23 = pcVar23 + 1;
          lVar28 = lVar28 + -0x500000000;
          pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 0x18);
        } while (pcVar23 < pcStack_2948);
      }
      __s = (code *)auStack_28d8;
      pfStack_2970 = (fdb_kvs_handle *)0x10e8f3;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_2970 = (fdb_kvs_handle *)0x10e909;
      fVar4 = fdb_compact_upto(pfStack_2950,(char *)__s,pfStack_2958[1].marker);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_2970 = (fdb_kvs_handle *)0x10e92d;
        fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2938._32_8_,
                                  (fdb_kvs_handle **)(auStack_2938 + 0x18),
                                  (pfStack_2958[1].kvs_markers)->seqnum);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_2970 = (fdb_kvs_handle *)0x10e936;
          compact_upto_test();
          goto LAB_0010e936;
        }
LAB_0010e996:
        __s = (code *)auStack_28d8;
        pfStack_2970 = (fdb_kvs_handle *)0x10e9a0;
        fdb_kvs_close((fdb_kvs_handle *)auStack_2938._24_8_);
        pfStack_2970 = (fdb_kvs_handle *)0x10e9af;
        fVar4 = fdb_free_snap_markers(pfStack_2958,(uint64_t)pcStack_2948);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pfStack_2970 = (fdb_kvs_handle *)0x10e9c1;
          fdb_close(pfStack_2950);
          lVar28 = 0;
          do {
            pfStack_2970 = (fdb_kvs_handle *)0x10e9d0;
            fdb_doc_free(*(fdb_doc **)(&fStack_28a8.kvs_config.create_if_missing + lVar28 * 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x14);
          pfStack_2970 = (fdb_kvs_handle *)0x10e9de;
          fdb_shutdown();
          pfStack_2970 = (fdb_kvs_handle *)0x10e9e3;
          memleak_end();
          pcVar23 = "single kv mode:";
          if ((char)iStack_293c != '\0') {
            pcVar23 = "multiple kv mode:";
          }
          pfStack_2970 = (fdb_kvs_handle *)0x10ea13;
          sprintf(acStack_2608,"compact upto marker in file test %s",pcVar23);
          pcVar23 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2970 = (fdb_kvs_handle *)0x10ea40;
          fprintf(_stderr,pcVar23,acStack_2608);
          return;
        }
        goto LAB_0010ead9;
      }
      goto LAB_0010eade;
    }
    if (pcStack_2948 != (char *)0x8) {
      pfStack_2970 = (fdb_kvs_handle *)0x10e7d7;
      compact_upto_test();
    }
    auStack_2938._8_8_ = ZEXT48(uVar27 + 1);
    pfVar14 = (fdb_kvs_handle *)auStack_2938;
    pvVar17 = (void *)0x0;
    do {
      pcVar23 = (char *)((long)pvVar17 * 3);
      if ((fdb_custom_cmp_variable)pfStack_2958[(long)pvVar17].num_kvs_markers !=
          (fdb_custom_cmp_variable)auStack_2938._8_8_) {
        pfStack_2970 = (fdb_kvs_handle *)0x10e8b4;
        compact_upto_test();
      }
      __s = (code *)((long)pvVar17 * -5 + 0x14);
      lVar28 = 8;
      pfVar6 = (fdb_kvs_handle *)0x0;
      auStack_2938._16_8_ = pvVar17;
      do {
        if (*(code **)(lVar28 + (long)&(pfStack_2958[(long)pvVar17].kvs_markers)->kv_store_name) !=
            __s) {
          pfStack_2970 = (fdb_kvs_handle *)0x10e88a;
          compact_upto_test();
        }
        pfStack_2970 = (fdb_kvs_handle *)0x10e83d;
        sprintf((char *)pfVar14,"kv%d",(ulong)pfVar6 & 0xffffffff);
        psVar3 = *(short **)((long)&pfStack_2958[(long)pvVar17].kvs_markers[-1].seqnum + lVar28);
        if ((char)psVar3[1] != auStack_2938[2] || *psVar3 != auStack_2938._0_2_) {
          pfStack_2970 = (fdb_kvs_handle *)0x10eacf;
          compact_upto_test();
          goto LAB_0010eacf;
        }
        pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
        lVar28 = lVar28 + 0x10;
      } while (pfVar11 != pfVar6);
      pvVar17 = (void *)(auStack_2938._16_8_ + 1);
    } while ((fdb_kvs_handle *)pvVar17 != pfVar11);
LAB_0010e936:
    __s = (code *)auStack_28d8;
    pfStack_2970 = (fdb_kvs_handle *)0x10e954;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2970 = (fdb_kvs_handle *)0x10e96a;
    fVar4 = fdb_compact_upto(pfStack_2950,(char *)__s,pfStack_2958[1].marker);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
    pfStack_2970 = (fdb_kvs_handle *)0x10e98e;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2938._40_8_,
                              (fdb_kvs_handle **)(auStack_2938 + 0x18),
                              pfStack_2958[1].kvs_markers[1].seqnum);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
  }
  else {
LAB_0010ead4:
    pfStack_2970 = (fdb_kvs_handle *)0x10ead9;
    compact_upto_test();
LAB_0010ead9:
    pfStack_2970 = (fdb_kvs_handle *)0x10eade;
    compact_upto_test();
LAB_0010eade:
    pfStack_2970 = (fdb_kvs_handle *)0x10eae3;
    compact_upto_test();
LAB_0010eae3:
    pfStack_2970 = (fdb_kvs_handle *)0x10eae8;
    compact_upto_test();
  }
  pfStack_2970 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_2998 = __s;
  pfStack_2990 = pfVar14;
  pfStack_2988 = pfVar6;
  pcStack_2980 = pcVar23;
  lStack_2978 = lVar28;
  pfStack_2970 = pfVar11;
  gettimeofday((timeval *)(auStack_2e10 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  pbVar9 = (btree *)auStack_2e10;
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_2da0[0x110] = '\0';
  auStack_2da0[0x111] = '\0';
  auStack_2da0[0x112] = '\0';
  auStack_2da0[0x113] = '\x01';
  auStack_2da0[0x114] = '\0';
  auStack_2da0[0x115] = '\0';
  auStack_2da0[0x116] = '\0';
  auStack_2da0[0x117] = '\0';
  auStack_2da0[0x118] = '\0';
  auStack_2da0[0x119] = '\x04';
  auStack_2da0[0x11a] = '\0';
  auStack_2da0[0x11b] = '\0';
  auStack_2da0[0x11c] = '\0';
  auStack_2da0[0x11d] = '\0';
  auStack_2da0[0x11e] = '\0';
  auStack_2da0[0x11f] = '\0';
  auStack_2da0._300_4_ = 1;
  auStack_2da0[0x137] = 0;
  pbVar26 = (btree *)&pfStack_2e48;
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",(fdb_config *)(auStack_2da0 + 0x108));
  ppfVar18 = &pfStack_2e50;
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_2e48,ppfVar18,(fdb_kvs_config *)pbVar9);
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb93;
  fVar4 = fdb_set_log_callback(pfStack_2e50,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_2e68 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_2e38,"./compact_test1",(fdb_config *)(auStack_2da0 + 0x108)
            );
    ppfVar18 = &pfStack_2e40;
    pfStack_2e68 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2e38._0_8_,ppfVar18,(fdb_kvs_config *)auStack_2e10);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ebe2;
    fVar4 = fdb_set_log_callback(pfStack_2e40,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar28 = 0;
    uVar15 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_2aa0,"key%d",uVar15 & 0xffffffff);
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_2da0 + 0x200,"meta%d",uVar15 & 0xffffffff);
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_2da0,"body%d",uVar15 & 0xffffffff);
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec4a;
      sVar7 = strlen(acStack_2aa0);
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec5d;
      sVar8 = strlen(auStack_2da0 + 0x200);
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec6d;
      sVar10 = strlen(auStack_2da0);
      pfStack_2e68 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_2e38 + lVar28 + 8),acStack_2aa0,sVar7,auStack_2da0 + 0x200
                     ,sVar8,auStack_2da0,sVar10);
      pfStack_2e68 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_2e50,*(fdb_doc **)(auStack_2e38 + uVar15 * 8 + 8));
      uVar15 = uVar15 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar15 == 1);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_2e58,*(void **)(auStack_2e38._16_8_ + 0x20),
                   *(size_t *)auStack_2e38._16_8_,*(void **)(auStack_2e38._16_8_ + 0x38),
                   *(size_t *)(auStack_2e38._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_2e58->file = true;
    pfStack_2e68 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_2e50,(fdb_doc *)pfStack_2e58);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_2e58);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_2e48,'\x01');
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_2e48,"./compact_test2");
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_2aa0,"key%d",2);
    pbVar26 = (btree *)(auStack_2da0 + 0x200);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)pbVar26,"meta%d",2);
    pfVar14 = (fdb_kvs_handle *)auStack_2da0;
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)pfVar14,"body%d",2);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed89;
    pfVar6 = (fdb_kvs_handle *)strlen(acStack_2aa0);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed94;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)pbVar26);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ed9f;
    sVar7 = strlen((char *)pfVar14);
    pfStack_2e68 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_2e38 + 0x18),acStack_2aa0,(size_t)pfVar6,pbVar26,
                   (size_t)pfVar11,pfVar14,sVar7);
    pfStack_2e68 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_2e50,(fdb_doc *)auStack_2e38._24_8_);
    pfStack_2e68 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_2e48,'\x01');
    pfStack_2e68 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_2e50);
    ppfVar18 = &pfStack_2e40;
    pfStack_2e68 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_2e40);
    pfStack_2e68 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_2e48);
    pbVar9 = (btree *)auStack_2e38;
    pfStack_2e68 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_2e38._0_8_);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_2e68 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)pbVar9,"./compact_test1",(fdb_config *)(auStack_2da0 + 0x108));
    pfStack_2e68 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2e38._0_8_,ppfVar18,(fdb_kvs_config *)auStack_2e10);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ee4d;
    fVar4 = fdb_set_log_callback(pfStack_2e40,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar14 = (fdb_kvs_handle *)0x0;
      ppfVar18 = &pfStack_2e58;
      while( true ) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_2e38 + (long)pfVar14 * 8 + 8))[4],
                       **(size_t **)(auStack_2e38 + (long)pfVar14 * 8 + 8),(void *)0x0,0,(void *)0x0
                       ,0);
        pfStack_2e68 = (fdb_kvs_handle *)0x10ee90;
        fVar4 = fdb_get(pfStack_2e40,(fdb_doc *)pfStack_2e58);
        pfVar19 = pfStack_2e58;
        if (pfVar14 != (fdb_kvs_handle *)0x1) break;
        pfVar19 = pfVar6;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_2e68 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_2e58);
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        pfVar6 = pfVar19;
        if (pfVar14 == (fdb_kvs_handle *)0x3) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_2e38._0_8_,&fStack_2de8);
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef28;
          iVar5 = strcmp("./compact_test2",fStack_2de8.filename);
          if (iVar5 != 0) {
            pfStack_2e68 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_2e40);
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_2e38._0_8_);
          lVar28 = 0;
          do {
            pfStack_2e68 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_2e38 + lVar28 * 8 + 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2e68 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar23,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar9 = pfStack_2e58->staletree;
        pfVar11 = *(fdb_kvs_handle **)(auStack_2e38 + (long)pfVar14 * 8 + 8);
        pbVar26 = pfVar11->staletree;
        pfStack_2e68 = (fdb_kvs_handle *)0x10eec9;
        iVar5 = bcmp(pbVar9,pbVar26,(size_t)(pfStack_2e58->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar9 = (pfVar19->field_6).seqtree;
          pbVar26 = (pfVar11->field_6).seqtree;
          pfStack_2e68 = (fdb_kvs_handle *)0x10eee8;
          iVar5 = bcmp(pbVar9,pbVar26,(size_t)(pfVar19->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010eef0;
          pfStack_2e68 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          pfVar6 = pfVar19;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar19 = pfVar6;
        pfStack_2e68 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_2e68 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      pfVar6 = pfVar19;
LAB_0010efc7:
      pfStack_2e68 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_2e68 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_2e68 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_2e68 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_33d0 = (fdb_kvs_handle *)0x10effb;
  ppfStack_2e90 = ppfVar18;
  pfStack_2e88 = pfVar14;
  pfStack_2e80 = pfVar6;
  pbStack_2e78 = pbVar9;
  pbStack_2e70 = pbVar26;
  pfStack_2e68 = pfVar11;
  gettimeofday(&tStack_3340,(__timezone_ptr_t)0x0);
  pfStack_33d0 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_33d0 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_33d0 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_3330;
  pfStack_33d0 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_2f88.buffercache_size = 0x1000000;
  fStack_2f88.wal_threshold = 0x400;
  fStack_2f88.flags = 1;
  fStack_2f88.compaction_threshold = '\0';
  ppfVar33 = &pfStack_33a8;
  pfStack_33d0 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar33,"./compact_test1",&fStack_2f88);
  ppfVar18 = &pfStack_33b0;
  pfStack_33d0 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_33a8,ppfVar18,config);
  pfStack_33d0 = (fdb_kvs_handle *)0x10f087;
  fVar4 = fdb_set_log_callback(pfStack_33b0,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_33d0 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_3218 + 0x100,"key%d",uVar15 & 0xffffffff);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_3218,"meta%d",uVar15 & 0xffffffff);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_3318,"body%d",uVar15 & 0xffffffff);
      ppfVar33 = (fdb_doc **)((long)apfStack_3398 + (long)pfVar14);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f0ef;
      pfVar6 = (fdb_kvs_handle *)strlen(auStack_3218 + 0x100);
      pfVar11 = (fdb_kvs_handle *)auStack_3218;
      pfStack_33d0 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar11);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f112;
      sVar7 = strlen(acStack_3318);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar33,auStack_3218 + 0x100,(size_t)pfVar6,pfVar11,(size_t)config,
                     acStack_3318,sVar7);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_33b0,apfStack_3398[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar15 != 10);
    pfStack_33d0 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_33a8,'\x01');
    pfStack_33d0 = (fdb_kvs_handle *)0x10f17a;
    fVar4 = fdb_snapshot_open(pfStack_33b0,&pfStack_33a0,10);
    ppfVar18 = (fdb_kvs_handle **)0xa;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_33d0 = (fdb_kvs_handle *)0x10f193;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_33a8,"./compact_test2");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_33d0 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_33b8,apfStack_3398[(long)config]->key,
                       apfStack_3398[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_33d0 = (fdb_kvs_handle *)0x10f1d6;
        fVar4 = fdb_get(pfStack_33b0,(fdb_doc *)pfStack_33b8);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_33d0 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_33d0 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_33b8);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_33d0 = (fdb_kvs_handle *)0x10f205;
      iVar5 = stat("./compact_test1",(stat *)(auStack_3218 + 0x200));
      if (iVar5 == 0) {
        pfStack_33d0 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_33d0 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_33b8,apfStack_3398[(long)config]->key,
                       apfStack_3398[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_33d0 = (fdb_kvs_handle *)0x10f249;
        fVar4 = fdb_get(pfStack_33a0,(fdb_doc *)pfStack_33b8);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_33d0 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_33b8);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_33d0 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_33a8);
          pfStack_33d0 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar28 = 0;
          do {
            pfStack_33d0 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_3398[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 10);
          pfStack_33d0 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_33d0 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar23,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar18 = &pfStack_33b8;
      pfStack_33d0 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_33d0 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_33d0 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_33d0 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_3b68 = (fdb_kvs_handle *)0x10f309;
  ppfStack_33f8 = ppfVar18;
  pfStack_33f0 = pfVar14;
  pfStack_33e8 = pfVar6;
  pfStack_33e0 = config;
  ppfStack_33d8 = ppfVar33;
  pfStack_33d0 = pfVar11;
  gettimeofday(&tStack_3ae0,(__timezone_ptr_t)0x0);
  pfStack_3b68 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_3b68 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3b68 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info_00 = (fdb_kvs_info *)auStack_3b28;
  pfStack_3b68 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_38d8.buffercache_size = 0x1000000;
  fStack_38d8.wal_threshold = 0x400;
  fStack_38d8.flags = 1;
  fStack_38d8.compaction_threshold = '\0';
  _Var34._M_i = (__int_type_conflict)(auStack_3b40 + 0x10);
  pfStack_3b68 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var34._M_i,"./compact_test1",&fStack_38d8);
  ppfVar18 = (fdb_kvs_handle **)auStack_3b40;
  pfStack_3b68 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_3b40._16_8_,ppfVar18,(char *)0x0,(fdb_kvs_config *)info_00
              );
  pfStack_3b68 = (fdb_kvs_handle *)0x10f394;
  pfVar19 = (fdb_kvs_handle *)auStack_3b40._0_8_;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_3b40._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_37e0 + 0x100,"key%d",uVar15 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_37e0,"meta%d",uVar15 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_3ad0,"body%d",uVar15 & 0xffffffff);
      _Var34._M_i = (long)apfStack_39d0 + (long)pfVar14;
      pfStack_3b68 = (fdb_kvs_handle *)0x10f3ff;
      pfVar6 = (fdb_kvs_handle *)strlen(auStack_37e0 + 0x100);
      pfVar11 = (fdb_kvs_handle *)auStack_37e0;
      pfStack_3b68 = (fdb_kvs_handle *)0x10f412;
      info_00 = (fdb_kvs_info *)strlen((char *)pfVar11);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f422;
      sVar7 = strlen(acStack_3ad0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var34._M_i,auStack_37e0 + 0x100,(size_t)pfVar6,pfVar11,
                     (size_t)info_00,acStack_3ad0,sVar7);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_3b40._0_8_,apfStack_39d0[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar15 != 0x1e);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_3b40._16_8_,'\0');
    pfStack_3b68 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_3b40 + 8),"./compact_test1.1",&fStack_38d8);
    ppfVar18 = (fdb_kvs_handle **)(auStack_3b50 + 8);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_3b40._8_8_,ppfVar18,(char *)0x0,
                 (fdb_kvs_config *)auStack_3b28);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f4bf;
    pfVar19 = (fdb_kvs_handle *)auStack_3b50._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3b50._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    pfVar14 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_37e0 + 0x100,"k2ey%d",uVar15 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_37e0,"m2eta%d",uVar15 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_3ad0,"b2ody%d",uVar15 & 0xffffffff);
      _Var34._M_i = (__int_type_conflict)(auStack_37e0 + (long)pfVar14 + 0x200);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f52a;
      pfVar6 = (fdb_kvs_handle *)strlen(auStack_37e0 + 0x100);
      pfVar11 = (fdb_kvs_handle *)auStack_37e0;
      pfStack_3b68 = (fdb_kvs_handle *)0x10f53d;
      info_00 = (fdb_kvs_info *)strlen((char *)pfVar11);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f54d;
      sVar7 = strlen(acStack_3ad0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var34._M_i,auStack_37e0 + 0x100,(size_t)pfVar6,pfVar11,
                     (size_t)info_00,acStack_3ad0,sVar7);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_3b50._8_8_,(fdb_doc *)auStack_34f0[uVar15 - 0x1e]);
      uVar15 = uVar15 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar15 != 0x3c);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_3b40._8_8_,'\0');
    pfStack_3b68 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3b50._8_8_,(fdb_kvs_info *)(auStack_3b28 + 0x18));
    ppfVar18 = apfStack_3b08;
    if (apfStack_3b08[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_3b68 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3b50._8_8_);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_3b40._8_8_);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f5e3;
    pfVar19 = (fdb_kvs_handle *)auStack_3b40._16_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_3b40._16_8_,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info_00 = (fdb_kvs_info *)auStack_3b40;
    pfStack_3b68 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3b40._0_8_);
    _Var34._M_i = (__int_type_conflict)(auStack_3b40 + 0x10);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_3b40._16_8_);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var34._M_i,"./compact_test1",&fStack_38d8);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_3b40._16_8_,(fdb_kvs_handle **)info_00,(char *)0x0,
                 (fdb_kvs_config *)auStack_3b28);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f644;
    pfVar19 = (fdb_kvs_handle *)auStack_3b40._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3b40._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    pfVar14 = (fdb_kvs_handle *)0x0;
    info_00 = (fdb_kvs_info *)auStack_3b50;
    do {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info_00,
                     (void *)(*(size_t **)((long)apfStack_39d0 + (long)pfVar14))[4],
                     **(size_t **)((long)apfStack_39d0 + (long)pfVar14),(void *)0x0,0,(void *)0x0,0)
      ;
      pfStack_3b68 = (fdb_kvs_handle *)0x10f68a;
      pfVar19 = (fdb_kvs_handle *)auStack_3b40._0_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_3b40._0_8_,(fdb_doc *)auStack_3b50._0_8_);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var34._M_i = (long)apfStack_39d0 + (long)pfVar14;
      pfStack_3b68 = (fdb_kvs_handle *)0x10f6b6;
      iVar5 = bcmp(*(btree **)(auStack_3b50._0_8_ + 0x38),(*(fdb_doc **)_Var34._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_3b50._0_8_)->custom_cmp);
      if (iVar5 != 0) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_3b68 = (fdb_kvs_handle *)0x10f6d3;
      iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_3b50._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var34._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_3b50._0_8_)->custom_cmp_param);
      if (iVar5 != 0) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_3b68 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_3b50._0_8_);
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).custom_cmp;
    } while (pfVar14 != (fdb_kvs_handle *)0xf0);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_3b40 + 8),"./compact_test1.1",&fStack_38d8);
    info_00 = (fdb_kvs_info *)(auStack_3b50 + 8);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_3b40._8_8_,(fdb_kvs_handle **)info_00,(char *)0x0,
                 (fdb_kvs_config *)auStack_3b28);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f757;
    pfVar19 = (fdb_kvs_handle *)auStack_3b50._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3b50._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      info_00 = (fdb_kvs_info *)(auStack_3b28 + 0x18);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_3b50._8_8_,info_00);
      if (apfStack_3b08[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var34._M_i = 0;
      ppfVar18 = (fdb_kvs_handle **)auStack_3b50;
      while( true ) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_37e0 + 0x200 + _Var34._M_i))[4],
                       **(size_t **)(auStack_37e0 + 0x200 + _Var34._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_3b68 = (fdb_kvs_handle *)0x10f7be;
        pfVar19 = (fdb_kvs_handle *)auStack_3b50._8_8_;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_3b50._8_8_,(fdb_doc *)auStack_3b50._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        info_00 = (fdb_kvs_info *)(auStack_37e0 + 0x200 + _Var34._M_i);
        pfStack_3b68 = (fdb_kvs_handle *)0x10f7ea;
        iVar5 = bcmp(*(btree **)(auStack_3b50._0_8_ + 0x38),*(void **)(info_00->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_3b50._0_8_)->custom_cmp);
        if (iVar5 != 0) {
          pfStack_3b68 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_3b68 = (fdb_kvs_handle *)0x10f807;
        iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_3b50._0_8_ + 0x40))
                     ->seqtree,*(void **)(info_00->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_3b50._0_8_)->custom_cmp_param);
        if (iVar5 != 0) {
          pfStack_3b68 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_3b68 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_3b50._0_8_);
        _Var34._M_i = _Var34._M_i + 8;
        if ((fdb_doc **)_Var34._M_i == (fdb_doc **)0x1e0) {
          lVar28 = 0;
          do {
            pfStack_3b68 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_39d0[lVar28]);
            pfStack_3b68 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_34f0[lVar28 + -0x1e]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x1e);
          lVar28 = 0;
          do {
            pfStack_3b68 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_34f0[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x1e);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3b40._0_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_3b40._16_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3b50._8_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_3b40._8_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_3b68 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_3b68 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar23,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_3b68 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_3b68 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_4340 = (fdb_kvs_handle *)0x10f937;
  ppfStack_3b90 = ppfVar18;
  pfStack_3b88 = pfVar14;
  pfStack_3b80 = pfVar6;
  pfStack_3b78 = info_00;
  ppfStack_3b70 = (fdb_doc **)_Var34._M_i;
  pfStack_3b68 = pfVar11;
  gettimeofday(&tStack_42c0,(__timezone_ptr_t)0x0);
  pfStack_4340 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_4340 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar22 = (fdb_kvs_handle *)auStack_42b0;
  pfStack_4340 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_42b0._8_8_ = (list *)0x0;
  auStack_42b0._16_8_ = (list *)0x400;
  auStack_42b0[0x2f] = '\0';
  if (pfVar19 == (fdb_kvs_handle *)0x0) {
    pfStack_4340 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4328;
    pfStack_4340 = (fdb_kvs_handle *)0x10f999;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_42b0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4340 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_4328;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4328,&pfStack_4320,&fStack_4308);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar28 = 0;
      uVar15 = 0;
      do {
        pfStack_4340 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_3fb8,"key%d",uVar15 & 0xffffffff);
        pfStack_4340 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_42b0 + 0x1f8,"meta%d",uVar15 & 0xffffffff);
        pfStack_4340 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_42b0 + 0xf8,"body%d",uVar15 & 0xffffffff);
        pfStack_4340 = (fdb_kvs_handle *)0x10fa20;
        pfVar6 = (fdb_kvs_handle *)strlen(acStack_3fb8);
        pfVar11 = (fdb_kvs_handle *)(auStack_42b0 + 0x1f8);
        pfStack_4340 = (fdb_kvs_handle *)0x10fa33;
        sVar7 = strlen((char *)pfVar11);
        pfStack_4340 = (fdb_kvs_handle *)0x10fa43;
        sVar8 = strlen(auStack_42b0 + 0xf8);
        pfStack_4340 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_3eb8 + lVar28),acStack_3fb8,(size_t)pfVar6,
                       pfVar11,sVar7,auStack_42b0 + 0xf8,sVar8);
        pfStack_4340 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_4320,apfStack_3eb8[uVar15]);
        uVar15 = uVar15 + 1;
        lVar28 = lVar28 + 8;
      } while (uVar15 != 100);
      pfStack_4340 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_4328,'\0');
      pfStack_4340 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_4320,(fdb_kvs_info *)auStack_42f0);
      pfVar19 = (fdb_kvs_handle *)(auStack_42f0 + 0x10);
      if ((filemgr *)auStack_42f0._16_8_ != (filemgr *)0x64) {
        pfStack_4340 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar28 = 0;
      _Var34._M_i = (__int_type_conflict)&pfStack_4318;
      do {
        pfStack_4340 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_4320,apfStack_3eb8[lVar28]);
        if (lVar28 == 0x32) {
          pfStack_4340 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var34._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_4328);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      pfStack_4340 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_4318,&pvStack_4310);
      pfStack_4340 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_4328,'\x01');
      pfStack_4340 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_4320,(fdb_kvs_info *)auStack_42f0);
      if ((filemgr *)auStack_42f0._16_8_ != (filemgr *)0x0) {
        pfStack_4340 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_4340 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_4320);
      pfVar22 = (fdb_kvs_handle *)&pfStack_4328;
      pfStack_4340 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_4328);
      pfStack_4340 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar22;
      fVar4 = fdb_open((fdb_file_handle **)pfVar22,"./compact_test1",(fdb_config *)auStack_42b0);
      pfVar14 = (fdb_kvs_handle *)0x64;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_4340 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_4328;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4328,&pfStack_4320,&fStack_4308);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_4340 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_4320,(fdb_kvs_info *)auStack_42f0);
        if ((filemgr *)auStack_42f0._16_8_ != (filemgr *)0x0) {
          pfStack_4340 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar28 = 0;
        do {
          pfStack_4340 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_3eb8[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 100);
        pfStack_4340 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_4320);
        pfStack_4340 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_4328);
        pfStack_4340 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_4340 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pfStack_4340 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar23,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_4340 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_4340 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_4340 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_4340 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_4340 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4328;
    pfStack_4340 = (fdb_kvs_handle *)0x10fc41;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_42b0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_4340 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_4328;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_4328,(char *)0x0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4340 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_4328);
      pfStack_4340 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_4340 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar20 = (char *)0x0;
  pfStack_180f8 = (fdb_kvs_handle *)0x10fcab;
  pfStack_180b0 = ptr_fhandle;
  pfStack_4368 = pfVar19;
  pfStack_4360 = pfVar14;
  pfStack_4358 = pfVar6;
  pfStack_4350 = pfVar22;
  ppfStack_4348 = (fdb_doc **)_Var34._M_i;
  pfStack_4340 = pfVar11;
  gettimeofday(&tStack_17f48,(__timezone_ptr_t)0x0);
  pfStack_180f8 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_180f8 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar19 = (fdb_kvs_handle *)auStack_18050;
  pfStack_180f8 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_180f8 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_18050._8_8_ = (kvs_ops_stat *)0x0;
  auStack_18050._16_8_ = (fdb_file_handle *)0x400;
  auStack_18050._36_4_ = 1;
  auStack_18050._46_2_ = 0x1e01;
  auStack_18050._56_8_ = (docio_handle *)0x1;
  auStack_18050._120_8_ = 0;
  pcVar23 = auStack_180e0;
  pfStack_180f8 = (fdb_kvs_handle *)0x10fd11;
  fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)pfVar19);
  if (fVar4 == FDB_RESULT_INVALID_CONFIG) {
    auStack_18050._120_8_ = 4;
    pfStack_180f8 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_180e0,"compact_test",(fdb_config *)auStack_18050);
    pfVar19 = (fdb_kvs_handle *)(auStack_180e0 + 8);
    pfStack_180f8 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_180e0._0_8_,(fdb_kvs_handle **)pfVar19,&fStack_180a8);
    pfStack_180f8 = (fdb_kvs_handle *)0x10fd69;
    pcVar23 = (char *)auStack_180e0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180e0._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_180f8 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar20 = (char *)0x0;
    uVar15 = 0;
    do {
      pfStack_180f8 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_17ef0,"key%04d",uVar15 & 0xffffffff);
      pfStack_180f8 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_17df0,"meta%04d",uVar15 & 0xffffffff);
      pfStack_180f8 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_17cf0,"body%04d",uVar15 & 0xffffffff);
      pfVar11 = (fdb_kvs_handle *)(&afStack_17bf0[0].kvs_config.create_if_missing + (long)pcVar20);
      pfStack_180f8 = (fdb_kvs_handle *)0x10fde9;
      sVar7 = strlen((char *)apfStack_17ef0);
      _Var34._M_i = sVar7 + 1;
      pfStack_180f8 = (fdb_kvs_handle *)0x10fdf5;
      sVar7 = strlen(acStack_17df0);
      pfVar6 = (fdb_kvs_handle *)(sVar7 + 1);
      pfStack_180f8 = (fdb_kvs_handle *)0x10fe01;
      sVar7 = strlen(acStack_17cf0);
      pfStack_180f8 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar11,apfStack_17ef0,_Var34._M_i,acStack_17df0,(size_t)pfVar6,
                     acStack_17cf0,sVar7 + 1);
      pfStack_180f8 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_180e0._8_8_,
              *(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + uVar15 * 8));
      uVar15 = uVar15 + 1;
      pcVar20 = (char *)((long)pcVar20 + 8);
    } while (uVar15 != 10000);
    pfVar19 = (fdb_kvs_handle *)auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_180e0._0_8_,'\0');
    pfStack_180f8 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_180e0._0_8_);
    pfStack_180f8 = (fdb_kvs_handle *)0x10fe7d;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_18050);
    pfVar14 = (fdb_kvs_handle *)0x2710;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_180f8 = (fdb_kvs_handle *)0x10fe99;
    pcVar23 = (char *)auStack_180e0._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180e0._0_8_,(fdb_kvs_handle **)(auStack_180e0 + 8)
                       ,&fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_180f8 = (fdb_kvs_handle *)0x10feb9;
    pcVar23 = (char *)auStack_180e0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180e0._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar19 = (fdb_kvs_handle *)&_Stack_17f38;
    pfStack_180f8 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_180e0._0_8_,(fdb_file_info *)pfVar19);
    pfStack_180f8 = (fdb_kvs_handle *)0x10fee5;
    iVar5 = strcmp((char *)_Stack_17f38._M_i,"compact_test");
    if (iVar5 != 0) {
      pfStack_180f8 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar20 = "key%04d";
    _Var34._M_i = (__int_type_conflict)apfStack_17ef0;
    pfVar6 = (fdb_kvs_handle *)0x0;
    pfVar22 = pfVar11;
    do {
      pfStack_180f8 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var34._M_i,"key%04d",(ulong)pfVar6 & 0xffffffff);
      pfStack_180f8 = (fdb_kvs_handle *)0x10ff20;
      sVar7 = strlen((char *)_Var34._M_i);
      pfStack_180f8 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_180c8,(void *)_Var34._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_180f8 = (fdb_kvs_handle *)0x10ff50;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_180e0._8_8_,(fdb_doc *)pfStack_180c8);
      pfVar11 = pfStack_180c8;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_180f8 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar19 = (fdb_kvs_handle *)(pfStack_180c8->field_6).seqtree;
      pfVar14 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_17bf0[0].kvs_config.create_if_missing + (long)pfVar6 * 8) +
                 0x40);
      pfStack_180f8 = (fdb_kvs_handle *)0x10ff7c;
      iVar5 = bcmp(pfVar19,pfVar14,(size_t)(pfStack_180c8->kvs_config).custom_cmp_param);
      pfVar22 = pfVar11;
      if (iVar5 != 0) {
        pfStack_180f8 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_180f8 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
    } while (pfVar6 != (fdb_kvs_handle *)0x2710);
    pfStack_180f8 = (fdb_kvs_handle *)0x10ffb0;
    pcVar23 = (char *)auStack_180e0._8_8_;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_180e0._8_8_,
                              (fdb_kvs_handle **)&pfStack_18088,10000);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_180f8 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_18088);
    pfVar19 = (fdb_kvs_handle *)auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_180e0._0_8_);
    pfStack_180f8 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_180f8 = (fdb_kvs_handle *)0x10fff2;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_180f8 = (fdb_kvs_handle *)0x11000e;
    pcVar23 = (char *)auStack_180e0._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180e0._0_8_,(fdb_kvs_handle **)(auStack_180e0 + 8)
                       ,&fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_180f8 = (fdb_kvs_handle *)0x11002e;
    pcVar23 = (char *)auStack_180e0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180e0._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar20 = "key%04d";
    _Var34._M_i = (__int_type_conflict)apfStack_17ef0;
    pfVar6 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_180f8 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var34._M_i,"key%04d",(ulong)pfVar6 & 0xffffffff);
      pfStack_180f8 = (fdb_kvs_handle *)0x110060;
      sVar7 = strlen((char *)_Var34._M_i);
      pfStack_180f8 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_180c8,(void *)_Var34._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_180f8 = (fdb_kvs_handle *)0x110090;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_180e0._8_8_,(fdb_doc *)pfStack_180c8);
      pfVar22 = pfStack_180c8;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar19 = (fdb_kvs_handle *)(pfStack_180c8->field_6).seqtree;
      pfVar14 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_17bf0[0].kvs_config.create_if_missing + (long)pfVar6 * 8) +
                 0x40);
      pfStack_180f8 = (fdb_kvs_handle *)0x1100bc;
      iVar5 = bcmp(pfVar19,pfVar14,(size_t)(pfStack_180c8->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001107eb;
      pfStack_180f8 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
      pfVar11 = pfVar22;
    } while (pfVar6 != (fdb_kvs_handle *)0x2710);
    pfVar19 = (fdb_kvs_handle *)auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_180e0._0_8_);
    pfStack_180f8 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_180f8 = (fdb_kvs_handle *)0x11010c;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_180f8 = (fdb_kvs_handle *)0x110128;
    pcVar23 = (char *)auStack_180e0._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180e0._0_8_,(fdb_kvs_handle **)(auStack_180e0 + 8)
                       ,&fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_180f8 = (fdb_kvs_handle *)0x110148;
    pcVar23 = (char *)auStack_180e0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180e0._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar20 = "key%04d";
    _Var34._M_i = (__int_type_conflict)apfStack_17ef0;
    pfVar6 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_180f8 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var34._M_i,"key%04d",(ulong)pfVar6 & 0xffffffff);
      pfStack_180f8 = (fdb_kvs_handle *)0x11017a;
      sVar7 = strlen((char *)_Var34._M_i);
      pfStack_180f8 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_180c8,(void *)_Var34._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_180f8 = (fdb_kvs_handle *)0x1101aa;
      pcVar23 = (char *)auStack_180e0._8_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_180e0._8_8_,(fdb_doc *)pfStack_180c8);
      pfVar22 = pfStack_180c8;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar19 = (fdb_kvs_handle *)(pfStack_180c8->field_6).seqtree;
      pfVar14 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_17bf0[0].kvs_config.create_if_missing + (long)pfVar6 * 8) +
                 0x40);
      pfStack_180f8 = (fdb_kvs_handle *)0x1101d6;
      iVar5 = bcmp(pfVar19,pfVar14,(size_t)(pfStack_180c8->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001107fb;
      pfStack_180f8 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
      pfVar11 = pfVar22;
    } while (pfVar6 != (fdb_kvs_handle *)0x2710);
    pfStack_180f8 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_180e0._0_8_);
    pcVar23 = (char *)&pfStack_180b8;
    pfStack_180f8 = (fdb_kvs_handle *)0x110219;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_less",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_180f8 = (fdb_kvs_handle *)0x110238;
    pcVar23 = (char *)pfStack_180b8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_180b8,(fdb_kvs_handle **)&pfStack_18070,
                       &fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_18050._46_2_ = auStack_18050._46_2_ & 0xff;
    pcVar23 = (char *)&pfStack_180c0;
    pfStack_180f8 = (fdb_kvs_handle *)0x11025d;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_180f8 = (fdb_kvs_handle *)0x110279;
    pcVar23 = (char *)pfStack_180c0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_180c0,(fdb_kvs_handle **)&aStack_18078.seqtree,
                       &fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_18050._46_2_ = auStack_18050._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_180d0;
    pfStack_180f8 = (fdb_kvs_handle *)0x11029e;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_180f8 = (fdb_kvs_handle *)0x1102ba;
    pcVar23 = (char *)pfStack_180d0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_180d0,(fdb_kvs_handle **)&aStack_18080.seqtree,
                       &fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_18050._46_2_ = 0x1e01;
    pcVar23 = auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x1102e1;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_180f8 = (fdb_kvs_handle *)0x1102fd;
    pcVar23 = (char *)auStack_180e0._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180e0._0_8_,(fdb_kvs_handle **)(auStack_180e0 + 8)
                       ,&fStack_180a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_180f8 = (fdb_kvs_handle *)0x11031d;
    pcVar23 = (char *)auStack_180e0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180e0._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar20 = (char *)0x0;
    pfStack_180f8 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_180f8 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_18050 + 0xf8),(__timezone_ptr_t)0x0);
    tVar36.tv_usec = _Stack_17f50._M_i;
    tVar36.tv_sec = auStack_18050._248_8_;
    do {
      pfVar22 = (fdb_kvs_handle *)0xfffffffffffec780;
      pfVar6 = (fdb_kvs_handle *)0x0;
      iVar5 = 0;
      aStack_18090 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
      do {
        pfStack_180f8 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_180e0._8_8_,*(fdb_doc **)(acStack_4370 + (long)pfVar22));
        pfStack_180f8 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_180e0._0_8_,'\0');
        uVar27 = (int)((ulong)pfVar6 / 100) * 100 + iVar5;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar27;
        if (uVar27 == 0) {
          pfStack_180f8 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_18070,*(fdb_doc **)(acStack_4370 + (long)pfVar22));
          pfStack_180f8 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_180b8,'\0');
        }
        pfStack_180f8 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_18078.seqtree,*(fdb_doc **)(acStack_4370 + (long)pfVar22));
        pfStack_180f8 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_180c0,'\0');
        pfStack_180f8 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_18080.seqtree,*(fdb_doc **)(acStack_4370 + (long)pfVar22));
        pfStack_180f8 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_180d0,'\0');
        pfStack_180f8 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_18060,(__timezone_ptr_t)0x0);
        pfStack_180f8 = (fdb_kvs_handle *)0x110420;
        tVar35 = _utime_gap(tVar36,tStack_18060);
        if (pfStack_180b0 <= (fdb_kvs_handle *)tVar35.tv_sec) {
          pcVar20 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar5 = iVar5 + -1;
        pfVar6 = (fdb_kvs_handle *)(ulong)((int)pfVar6 + 1);
        pfVar22 = (fdb_kvs_handle *)&(pfVar22->kvs_config).custom_cmp;
        pcVar20 = (char *)aStack_18090;
      } while (pfVar22 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar20 == 0);
    pfStack_180f8 = (fdb_kvs_handle *)0x110459;
    pcVar23 = (char *)auStack_180e0._0_8_;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_180e0._0_8_,0x3c);
    pfVar19 = (fdb_kvs_handle *)auStack_18050._248_8_;
    _Var34._M_i = _Stack_17f50._M_i;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_180f8 = (fdb_kvs_handle *)0x110470;
    pcVar23 = (char *)auStack_180e0._0_8_;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_180e0._0_8_,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_180f8 = (fdb_kvs_handle *)0x110484;
    pcVar23 = (char *)pfStack_180c0;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_180c0,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_180f8 = (fdb_kvs_handle *)0x11049d;
    pcVar23 = (char *)pfStack_180d0;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_180d0,"compact_test_manual_compacted");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_18050._46_2_ = auStack_18050._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_18068;
    pfStack_180f8 = (fdb_kvs_handle *)0x1104c5;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_180f8 = (fdb_kvs_handle *)0x1104e1;
    pcVar23 = (char *)pfStack_180d0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_180d0,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_180f8 = (fdb_kvs_handle *)0x1104f7;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18068);
    pcVar23 = (char *)pfStack_18068;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_180f8 = (fdb_kvs_handle *)0x110513;
    pcVar23 = (char *)pfStack_180d0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_180d0,'\x01',10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_180f8 = (fdb_kvs_handle *)0x11052f;
    pcVar23 = (char *)pfStack_180d0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_180d0,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_180f8 = (fdb_kvs_handle *)0x110541;
    pcVar23 = (char *)pfStack_180d0;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_180d0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_18050[0x2e] = 1;
    pcVar23 = (char *)&pfStack_180d0;
    pfStack_180f8 = (fdb_kvs_handle *)0x110566;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_180f8 = (fdb_kvs_handle *)0x11057c;
    pcVar23 = (char *)pfStack_180c0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_180c0,'\0',0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_180f8 = (fdb_kvs_handle *)0x11058e;
    pcVar23 = (char *)pfStack_180c0;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_180c0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_18050._46_2_ = auStack_18050._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_180c0;
    pfStack_180f8 = (fdb_kvs_handle *)0x1105b3;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar20 = "compact_test_non.manual";
    pfStack_180f8 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_180c0,"compact_test_non.manual");
    pfVar19 = (fdb_kvs_handle *)auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_180e0._0_8_);
    pfStack_180f8 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_180b8);
    pfStack_180f8 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_180d0);
    auStack_18050[0x2e] = 1;
    pfStack_180f8 = (fdb_kvs_handle *)0x110607;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test_non.manual",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar23 = "compact_test_non.manual";
    pfStack_180f8 = (fdb_kvs_handle *)0x110624;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_18050._46_2_ = auStack_18050._46_2_ & 0xff00;
    pcVar23 = auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x11064a;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar23 = "compact_test_manual_compacted";
    pfStack_180f8 = (fdb_kvs_handle *)0x110667;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_18050[0x2e] = 1;
    pcVar23 = "compact_test_manual_compacted";
    pfStack_180f8 = (fdb_kvs_handle *)0x110688;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_18050._46_2_ = auStack_18050._46_2_ & 0xff00;
    pcVar23 = "compact_test_non.manual";
    pfStack_180f8 = (fdb_kvs_handle *)0x1106a8;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_180f8 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_180c0);
    pfStack_180f8 = (fdb_kvs_handle *)0x1106c0;
    fVar4 = fdb_shutdown();
    pcVar23 = (char *)pfStack_180c0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar23 = "compact_test_non.manual";
    pfStack_180f8 = (fdb_kvs_handle *)0x1106dc;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_18050._36_4_ = 2;
    pcVar23 = auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x110704;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar23 = auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x110726;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar23 = auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x110748;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar23 = auStack_180e0;
    pfStack_180f8 = (fdb_kvs_handle *)0x11076a;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non.manual",
                     (fdb_config *)auStack_18050);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      lVar28 = 0;
      do {
        pfStack_180f8 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10000);
      pfStack_180f8 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_180f8 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_180f8 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar23,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_180f8 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_180f8 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_180f8 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_180f8 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_180f8 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_180f8 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_180f8 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_180f8 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar22 = pfVar11;
LAB_00110833:
    pfStack_180f8 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_180f8 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_180f8 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_180f8 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_180f8 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_180f8 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_180f8 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_180f8 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_180f8 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_180f8 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_180f8 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_180f8 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_180f8 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_180f8 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_180f8 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_180f8 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_180f8 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_180f8 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_180f8 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_180f8 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_180f8 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_180f8 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_180f8 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_18290 = (fdb_kvs_handle *)0x110916;
  aStack_18120 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  pfStack_18118 = pfVar14;
  pfStack_18110 = pfVar6;
  pfStack_18108 = pfVar19;
  ppfStack_18100 = (fdb_doc **)_Var34._M_i;
  pfStack_180f8 = pfVar22;
  gettimeofday(&tStack_18240,(__timezone_ptr_t)0x0);
  pfStack_18290 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_18290 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18290 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_181ea = 1;
  uStack_181e0._0_2_ = 1;
  uStack_181e0._2_2_ = 0;
  uStack_181e0._4_4_ = 0;
  pfStack_18290 = (fdb_kvs_handle *)0x110955;
  fVar4 = fdb_open(&pfStack_18280,"compact_test",(fdb_config *)(auStack_18230 + 0x18));
  pfVar30 = (fdb_config *)(auStack_18230 + 0x18);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar30 = (fdb_config *)auStack_18230;
    pfStack_18290 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_18290 = (fdb_kvs_handle *)0x11097c;
    fVar4 = fdb_kvs_open_default(pfStack_18280,&pfStack_18278,(fdb_kvs_config *)pfVar30);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_18290 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_18250,(__timezone_ptr_t)0x0);
    pfStack_18290 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar23 & 0xffffffff);
    tVar35.tv_usec = tStack_18250.tv_usec;
    tVar35.tv_sec = tStack_18250.tv_sec;
    pfVar6 = (fdb_kvs_handle *)((long)&atStack_18270[1].tv_sec + 1);
    pfVar22 = (fdb_kvs_handle *)0x0;
    do {
      iVar5 = (int)pfVar22;
      pfStack_18290 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)pfVar6,"%d",pfVar22);
      pfVar14 = pfStack_18278;
      pfStack_18290 = (fdb_kvs_handle *)0x1109d1;
      sVar7 = strlen((char *)pfVar6);
      pfStack_18290 = (fdb_kvs_handle *)0x1109ec;
      fVar4 = fdb_set_kv(pfVar14,pfVar6,sVar7,"value",5);
      pfVar30 = (fdb_config *)tStack_18250.tv_sec;
      _Var34._M_i = tStack_18250.tv_usec;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_18290 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_18290 = (fdb_kvs_handle *)0x110a00;
      fVar4 = fdb_commit(pfStack_18280,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_18290 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_18290 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_18270,(__timezone_ptr_t)0x0);
      pfStack_18290 = (fdb_kvs_handle *)0x110a29;
      tVar36 = _utime_gap(tVar35,atStack_18270[0]);
    } while (((fdb_kvs_handle *)tVar36.tv_sec < pcVar23) &&
            (pfVar22 = (fdb_kvs_handle *)(ulong)(iVar5 + 1), iVar5 != 99999));
    pfStack_18290 = (fdb_kvs_handle *)0x110a49;
    fVar4 = fdb_close(pfStack_18280);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_18290 = (fdb_kvs_handle *)0x110a52;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_18290 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_18290 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar23,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_18290 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_18290 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_18290 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_18290 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_182b8 = (fdb_kvs_handle *)pcVar23;
  pfStack_182b0 = pfVar14;
  pfStack_182a8 = pfVar6;
  pfStack_182a0 = pfVar30;
  ppfStack_18298 = (fdb_doc **)_Var34._M_i;
  pfStack_18290 = pfVar22;
  gettimeofday(&tStack_185c0,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18630._32_8_ = (btree *)0x0;
  auStack_18630._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_183b0.wal_threshold = 0x1000;
  fStack_183b0.compaction_mode = '\x01';
  fStack_183b0.compaction_threshold = '\n';
  fStack_183b0.compactor_sleep_duration = 1;
  info_01 = (fdb_file_info *)0x14e0c5;
  pfVar11 = (fdb_kvs_handle *)&pfStack_18650;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar4 = fdb_open_custom_cmp((fdb_file_handle **)pfVar11,"compact_test",&fStack_183b0,1,
                              (char **)(auStack_18630 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18630 + 0x18),(void **)0x0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18630._16_8_ = afStack_185b0[0].doc_count;
    auStack_18630._0_8_ = afStack_185b0[0].filename;
    auStack_18630._8_8_ = afStack_185b0[0].new_filename;
    info_01 = (fdb_file_info *)auStack_18648;
    pfVar11 = pfStack_18650;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18650,(fdb_kvs_handle **)info_01,
                       (fdb_kvs_config *)auStack_18630);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_01 = (fdb_file_info *)auStack_18638;
    kvs_config_00 = (fdb_file_info *)auStack_18630;
    pfVar11 = pfStack_18650;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18650,(fdb_kvs_handle **)info_01,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar15 = 0;
    do {
      sprintf((char *)afStack_185b0,"key%06d",uVar15);
      sprintf((char *)afStack_184b0,"body%06d",uVar15);
      pfVar11 = (fdb_kvs_handle *)auStack_18648._0_8_;
      sVar7 = strlen((char *)afStack_185b0);
      sVar8 = strlen((char *)afStack_184b0);
      kvs_config_00 = afStack_184b0;
      info_01 = afStack_185b0;
      fVar4 = fdb_set_kv(pfVar11,afStack_185b0,sVar7,afStack_184b0,sVar8);
      handle = auStack_18638;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar7 = strlen((char *)afStack_185b0);
      sVar8 = strlen((char *)afStack_184b0);
      kvs_config_00 = afStack_184b0;
      info_01 = afStack_185b0;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_185b0,sVar7,afStack_184b0,sVar8);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar11 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar27 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar27;
    } while (uVar27 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_18630;
    auStack_18630._8_8_ = _compact_test_keycmp;
    info_01 = (fdb_file_info *)(auStack_18648 + 8);
    pfVar11 = pfStack_18650;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18650,(fdb_kvs_handle **)info_01,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_01 = afStack_185b0;
    sprintf((char *)info_01,"key%06d",0);
    kvs_config_00 = afStack_184b0;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar7 = strlen((char *)info_01);
    sVar8 = strlen((char *)kvs_config_00);
    fVar4 = fdb_set_kv((fdb_kvs_handle *)auStack_18648._8_8_,info_01,sVar7,kvs_config_00,sVar8);
    pfVar11 = (fdb_kvs_handle *)auStack_18648._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_01 = (fdb_file_info *)0x0;
    pfVar11 = pfStack_18650;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18650,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar15 = 0;
    uVar31 = 0;
    do {
      sprintf((char *)afStack_185b0,"key%06d",uVar31);
      sprintf((char *)afStack_184b0,"body%06d",uVar31);
      pfVar11 = (fdb_kvs_handle *)auStack_18648._0_8_;
      sVar7 = strlen((char *)afStack_185b0);
      sVar8 = strlen((char *)afStack_184b0);
      kvs_config_00 = afStack_184b0;
      info_01 = afStack_185b0;
      fVar4 = fdb_set_kv(pfVar11,afStack_185b0,sVar7,afStack_184b0,sVar8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_01 = (fdb_file_info *)(auStack_18630 + 0x28);
      pfVar11 = pfStack_18650;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18650,info_01);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar15 < uStack_185e0) {
        uVar15 = uStack_185e0;
      }
      uVar27 = (int)uVar31 + 1;
      uVar31 = (ulong)uVar27;
    } while (uVar27 != 10000);
    info_01 = (fdb_file_info *)0x0;
    pfVar11 = pfStack_18650;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18650,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_01 = (fdb_file_info *)(auStack_18630 + 0x28);
    pfVar11 = pfStack_18650;
    fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18650,info_01);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar15 < uStack_185e0) {
      uVar15 = uStack_185e0;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar15);
    do {
      sleep(1);
      info_01 = (fdb_file_info *)(auStack_18630 + 0x28);
      pfVar11 = pfStack_18650;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18650,
                                (fdb_file_info *)(auStack_18630 + 0x28));
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar15 <= uStack_185e0);
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18650);
    pfVar11 = pfStack_18650;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      pfVar11 = pfStack_18650;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar23,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_01 == kvs_config_00) {
    memcmp(pfVar11,__s2,(size_t)info_01);
    return;
  }
  if (info_01 < kvs_config_00) {
    kvs_config_00 = info_01;
  }
  memcmp(pfVar11,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void compact_with_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test2 compact_test1 > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test1", info.filename));

    // update documents
    for (i=0;i<n;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
                       (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // Open the database with another handle.
    fdb_file_handle *second_dbfile;
    fdb_kvs_handle *second_dbh;
    fdb_open(&second_dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(second_dbfile, &second_dbh, &kvs_config);
    status = fdb_set_log_callback(second_dbh, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compactions with a handle still open on the first old file
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // MB-12977: retest compaction again..
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(second_dbh, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    // The actual file name should be a compacted one.
    TEST_CHK(!strcmp("./compact_test1.3", info.filename));

    fdb_kvs_close(second_dbh);
    fdb_close(second_dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test1 compact_test.fdb > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compaction
    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test.fdb", info.filename));
    TEST_CHK(info.doc_count == 100);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction with reopen test");
}